

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  int iVar98;
  float fVar99;
  undefined4 uVar100;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar136;
  float fVar137;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  float fVar144;
  float fVar145;
  vint4 ai_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  vint4 ai_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  __m128 a;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar200 [16];
  undefined1 auVar209 [32];
  float fVar210;
  vfloat4 a0_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar216;
  float fVar226;
  float fVar227;
  vfloat4 a0_3;
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar242;
  vfloat4 b0_2;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  vfloat4 b0_3;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_378 [16];
  Primitive *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar24;
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  float fVar138;
  float fVar143;
  undefined1 auVar255 [32];
  
  PVar5 = prim[1];
  uVar23 = (ulong)(byte)PVar5;
  lVar25 = uVar23 * 0x25;
  fVar99 = *(float *)(prim + lVar25 + 0x12);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar37 = vsubps_avx(auVar37,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar62._0_4_ = fVar99 * auVar37._0_4_;
  auVar62._4_4_ = fVar99 * auVar37._4_4_;
  auVar62._8_4_ = fVar99 * auVar37._8_4_;
  auVar62._12_4_ = fVar99 * auVar37._12_4_;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 4 + 6)));
  auVar41._0_4_ = fVar99 * auVar38._0_4_;
  auVar41._4_4_ = fVar99 * auVar38._4_4_;
  auVar41._8_4_ = fVar99 * auVar38._8_4_;
  auVar41._12_4_ = fVar99 * auVar38._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 5 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 6 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xf + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar23 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1a + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1b + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1c + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar147._4_4_ = auVar41._0_4_;
  auVar147._0_4_ = auVar41._0_4_;
  auVar147._8_4_ = auVar41._0_4_;
  auVar147._12_4_ = auVar41._0_4_;
  auVar54 = vshufps_avx(auVar41,auVar41,0x55);
  auVar56 = vshufps_avx(auVar41,auVar41,0xaa);
  fVar99 = auVar56._0_4_;
  auVar60._0_4_ = fVar99 * auVar39._0_4_;
  fVar231 = auVar56._4_4_;
  auVar60._4_4_ = fVar231 * auVar39._4_4_;
  fVar216 = auVar56._8_4_;
  auVar60._8_4_ = fVar216 * auVar39._8_4_;
  fVar226 = auVar56._12_4_;
  auVar60._12_4_ = fVar226 * auVar39._12_4_;
  auVar48._0_4_ = auVar49._0_4_ * fVar99;
  auVar48._4_4_ = auVar49._4_4_ * fVar231;
  auVar48._8_4_ = auVar49._8_4_ * fVar216;
  auVar48._12_4_ = auVar49._12_4_ * fVar226;
  auVar42._0_4_ = auVar53._0_4_ * fVar99;
  auVar42._4_4_ = auVar53._4_4_ * fVar231;
  auVar42._8_4_ = auVar53._8_4_ * fVar216;
  auVar42._12_4_ = auVar53._12_4_ * fVar226;
  auVar56 = vfmadd231ps_fma(auVar60,auVar54,auVar38);
  auVar57 = vfmadd231ps_fma(auVar48,auVar54,auVar52);
  auVar54 = vfmadd231ps_fma(auVar42,auVar51,auVar54);
  auVar58 = vfmadd231ps_fma(auVar56,auVar147,auVar37);
  auVar57 = vfmadd231ps_fma(auVar57,auVar147,auVar46);
  auVar59 = vfmadd231ps_fma(auVar54,auVar50,auVar147);
  auVar249._4_4_ = auVar62._0_4_;
  auVar249._0_4_ = auVar62._0_4_;
  auVar249._8_4_ = auVar62._0_4_;
  auVar249._12_4_ = auVar62._0_4_;
  auVar54 = vshufps_avx(auVar62,auVar62,0x55);
  auVar56 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar99 = auVar56._0_4_;
  auVar148._0_4_ = fVar99 * auVar39._0_4_;
  fVar231 = auVar56._4_4_;
  auVar148._4_4_ = fVar231 * auVar39._4_4_;
  fVar216 = auVar56._8_4_;
  auVar148._8_4_ = fVar216 * auVar39._8_4_;
  fVar226 = auVar56._12_4_;
  auVar148._12_4_ = fVar226 * auVar39._12_4_;
  auVar64._0_4_ = auVar49._0_4_ * fVar99;
  auVar64._4_4_ = auVar49._4_4_ * fVar231;
  auVar64._8_4_ = auVar49._8_4_ * fVar216;
  auVar64._12_4_ = auVar49._12_4_ * fVar226;
  auVar63._0_4_ = auVar53._0_4_ * fVar99;
  auVar63._4_4_ = auVar53._4_4_ * fVar231;
  auVar63._8_4_ = auVar53._8_4_ * fVar216;
  auVar63._12_4_ = auVar53._12_4_ * fVar226;
  auVar38 = vfmadd231ps_fma(auVar148,auVar54,auVar38);
  auVar39 = vfmadd231ps_fma(auVar64,auVar54,auVar52);
  auVar52 = vfmadd231ps_fma(auVar63,auVar54,auVar51);
  auVar40 = vfmadd231ps_fma(auVar38,auVar249,auVar37);
  auVar41 = vfmadd231ps_fma(auVar39,auVar249,auVar46);
  auVar85._16_16_ = in_YmmResult._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar267 = ZEXT1664(auVar37);
  auVar42 = vfmadd231ps_fma(auVar52,auVar249,auVar50);
  auVar38 = vandps_avx512vl(auVar58,auVar37);
  auVar180._8_4_ = 0x219392ef;
  auVar180._0_8_ = 0x219392ef219392ef;
  auVar180._12_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar38,auVar180,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar43._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar58._12_4_;
  auVar38 = vandps_avx512vl(auVar57,auVar37);
  uVar35 = vcmpps_avx512vl(auVar38,auVar180,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar44._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._12_4_;
  auVar37 = vandps_avx512vl(auVar59,auVar37);
  uVar35 = vcmpps_avx512vl(auVar37,auVar180,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar45._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar59._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar59._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar59._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar59._12_4_;
  auVar37 = vrcp14ps_avx512vl(auVar43);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar268 = ZEXT1664(auVar38);
  auVar39 = vfnmadd213ps_avx512vl(auVar43,auVar37,auVar38);
  auVar58 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar44);
  auVar39 = vfnmadd213ps_avx512vl(auVar44,auVar37,auVar38);
  auVar59 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar45);
  auVar38 = vfnmadd213ps_avx512vl(auVar45,auVar37,auVar38);
  auVar55 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
  fVar99 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar25 + 0x16)) *
           *(float *)(prim + lVar25 + 0x1a);
  auVar167._4_4_ = fVar99;
  auVar167._0_4_ = fVar99;
  auVar167._8_4_ = fVar99;
  auVar167._12_4_ = fVar99;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar23 * 7 + 6);
  auVar37 = vpmovsxwd_avx(auVar37);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar23 * 0xb + 6);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar46 = vsubps_avx(auVar38,auVar37);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar23 * 9 + 6);
  auVar38 = vpmovsxwd_avx(auVar39);
  auVar39 = vfmadd213ps_fma(auVar46,auVar167,auVar37);
  auVar37 = vcvtdq2ps_avx(auVar38);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar23 * 0xd + 6);
  auVar38 = vpmovsxwd_avx(auVar46);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar37);
  auVar46 = vfmadd213ps_fma(auVar38,auVar167,auVar37);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar23 * 0x12 + 6);
  auVar37 = vpmovsxwd_avx(auVar52);
  auVar37 = vcvtdq2ps_avx(auVar37);
  uVar35 = (ulong)(uint)((int)(uVar23 * 5) << 2);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar23 * 2 + uVar35 + 6);
  auVar38 = vpmovsxwd_avx(auVar49);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar37);
  auVar52 = vfmadd213ps_fma(auVar38,auVar167,auVar37);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar37 = vpmovsxwd_avx(auVar50);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar23 * 0x18 + 6);
  auVar38 = vpmovsxwd_avx(auVar51);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar37);
  auVar49 = vfmadd213ps_fma(auVar38,auVar167,auVar37);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar23 * 0x1d + 6);
  auVar37 = vpmovsxwd_avx(auVar53);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar23 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar38 = vpmovsxwd_avx(auVar54);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar37);
  auVar50 = vfmadd213ps_fma(auVar38,auVar167,auVar37);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar23) + 6);
  auVar37 = vpmovsxwd_avx(auVar56);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar23 * 0x23 + 6);
  auVar38 = vpmovsxwd_avx(auVar57);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar37);
  auVar38 = vfmadd213ps_fma(auVar38,auVar167,auVar37);
  auVar37 = vsubps_avx(auVar39,auVar40);
  auVar168._0_4_ = auVar58._0_4_ * auVar37._0_4_;
  auVar168._4_4_ = auVar58._4_4_ * auVar37._4_4_;
  auVar168._8_4_ = auVar58._8_4_ * auVar37._8_4_;
  auVar168._12_4_ = auVar58._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar46,auVar40);
  auVar61._0_4_ = auVar58._0_4_ * auVar37._0_4_;
  auVar61._4_4_ = auVar58._4_4_ * auVar37._4_4_;
  auVar61._8_4_ = auVar58._8_4_ * auVar37._8_4_;
  auVar61._12_4_ = auVar58._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar52,auVar41);
  auVar149._0_4_ = auVar59._0_4_ * auVar37._0_4_;
  auVar149._4_4_ = auVar59._4_4_ * auVar37._4_4_;
  auVar149._8_4_ = auVar59._8_4_ * auVar37._8_4_;
  auVar149._12_4_ = auVar59._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar49,auVar41);
  auVar65._0_4_ = auVar59._0_4_ * auVar37._0_4_;
  auVar65._4_4_ = auVar59._4_4_ * auVar37._4_4_;
  auVar65._8_4_ = auVar59._8_4_ * auVar37._8_4_;
  auVar65._12_4_ = auVar59._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar50,auVar42);
  auVar139._0_4_ = auVar55._0_4_ * auVar37._0_4_;
  auVar139._4_4_ = auVar55._4_4_ * auVar37._4_4_;
  auVar139._8_4_ = auVar55._8_4_ * auVar37._8_4_;
  auVar139._12_4_ = auVar55._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar38,auVar42);
  auVar47._0_4_ = auVar55._0_4_ * auVar37._0_4_;
  auVar47._4_4_ = auVar55._4_4_ * auVar37._4_4_;
  auVar47._8_4_ = auVar55._8_4_ * auVar37._8_4_;
  auVar47._12_4_ = auVar55._12_4_ * auVar37._12_4_;
  auVar37 = vpminsd_avx(auVar168,auVar61);
  auVar38 = vpminsd_avx(auVar149,auVar65);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar38 = vpminsd_avx(auVar139,auVar47);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar58._4_4_ = uVar100;
  auVar58._0_4_ = uVar100;
  auVar58._8_4_ = uVar100;
  auVar58._12_4_ = uVar100;
  auVar38 = vmaxps_avx512vl(auVar38,auVar58);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  local_288 = vmulps_avx512vl(auVar37,auVar59);
  auVar37 = vpmaxsd_avx(auVar168,auVar61);
  auVar38 = vpmaxsd_avx(auVar149,auVar65);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar38 = vpmaxsd_avx(auVar139,auVar47);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar55._4_4_ = uVar100;
  auVar55._0_4_ = uVar100;
  auVar55._8_4_ = uVar100;
  auVar55._12_4_ = uVar100;
  auVar38 = vminps_avx512vl(auVar38,auVar55);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar40._8_4_ = 0x3f800003;
  auVar40._0_8_ = 0x3f8000033f800003;
  auVar40._12_4_ = 0x3f800003;
  auVar37 = vmulps_avx512vl(auVar37,auVar40);
  auVar38 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_288,auVar37,2);
  uVar35 = vpcmpgtd_avx512vl(auVar38,_DAT_01f7fcf0);
  uVar35 = ((byte)uVar13 & 0xf) & uVar35;
  if ((char)uVar35 == '\0') {
    bVar29 = false;
  }
  else {
    local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar37 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar264 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar270 = ZEXT1664(auVar37);
    local_360 = prim;
    do {
      lVar25 = 0;
      for (uVar23 = uVar35; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar30 = *(uint *)(local_360 + 2);
      pGVar7 = (context->scene->geometries).items[uVar30].ptr;
      fVar99 = (pGVar7->time_range).lower;
      fVar138 = pGVar7->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar99) / ((pGVar7->time_range).upper - fVar99));
      auVar37 = vroundss_avx(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),9);
      auVar38 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar37 = vminss_avx(auVar37,auVar38);
      auVar40 = vmaxss_avx512f(auVar264._0_16_,auVar37);
      uVar23 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               (ulong)*(uint *)(local_360 + lVar25 * 4 + 6) *
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar27 = (long)(int)auVar40._0_4_ * 0x38;
      lVar9 = *(long *)(_Var8 + lVar27);
      lVar10 = *(long *)(_Var8 + 0x10 + lVar27);
      auVar37 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar23);
      lVar25 = uVar23 + 1;
      auVar38 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar25);
      lVar1 = uVar23 + 2;
      auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
      lVar2 = uVar23 + 3;
      auVar46 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
      lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
      lVar10 = *(long *)(lVar9 + lVar27);
      lVar11 = *(long *)(lVar9 + 0x10 + lVar27);
      auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar23);
      auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
      auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
      lVar10 = *(long *)(_Var8 + 0x38 + lVar27);
      lVar11 = *(long *)(_Var8 + 0x48 + lVar27);
      auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar23);
      auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
      auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
      local_298 = vpbroadcastd_avx512vl();
      lVar10 = *(long *)(lVar9 + 0x38 + lVar27);
      lVar9 = *(long *)(lVar9 + 0x48 + lVar27);
      auVar58 = *(undefined1 (*) [16])(lVar10 + uVar23 * lVar9);
      auVar59 = *(undefined1 (*) [16])(lVar10 + lVar25 * lVar9);
      auVar55 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
      fVar138 = fVar138 - auVar40._0_4_;
      auVar81._0_16_ = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
      auVar40 = vmulps_avx512vl(auVar46,auVar81._0_16_);
      auVar108._8_4_ = 0x3e2aaaab;
      auVar108._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar108._12_4_ = 0x3e2aaaab;
      auVar41 = vfmadd213ps_avx512vl(auVar108,auVar39,auVar40);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar38,auVar42);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar37,auVar108);
      auVar65 = auVar270._0_16_;
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar39,auVar65);
      auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar38,auVar81._0_16_);
      auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar37,auVar65);
      auVar43 = vmulps_avx512vl(auVar51,auVar81._0_16_);
      auVar44 = vfmadd213ps_avx512vl(auVar108,auVar50,auVar43);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar49,auVar42);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar52,auVar108);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar65);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar49,auVar81._0_16_);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar52,auVar65);
      auVar45 = vmulps_avx512vl(auVar46,auVar108);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar39,auVar42);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar38,auVar108);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar37,auVar81._0_16_);
      auVar46 = vmulps_avx512vl(auVar46,auVar65);
      auVar39 = vfmadd231ps_avx512vl(auVar46,auVar81._0_16_,auVar39);
      auVar38 = vfnmadd231ps_avx512vl(auVar39,auVar65,auVar38);
      auVar47 = vfnmadd231ps_avx512vl(auVar38,auVar81._0_16_,auVar37);
      auVar101._0_4_ = auVar51._0_4_ * 0.16666667;
      auVar101._4_4_ = auVar51._4_4_ * 0.16666667;
      auVar101._8_4_ = auVar51._8_4_ * 0.16666667;
      auVar101._12_4_ = auVar51._12_4_ * 0.16666667;
      auVar37 = vfmadd231ps_avx512vl(auVar101,auVar50,auVar42);
      auVar37 = vfmadd231ps_fma(auVar37,auVar49,auVar108);
      auVar48 = vfmadd231ps_avx512vl(auVar37,auVar52,auVar81._0_16_);
      auVar37 = vmulps_avx512vl(auVar51,auVar65);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar81._0_16_,auVar50);
      auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar65,auVar49);
      auVar49 = vfnmadd231ps_avx512vl(auVar37,auVar81._0_16_,auVar52);
      auVar37 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar38 = vshufps_avx512vl(auVar44,auVar44,0xc9);
      fVar124 = auVar40._0_4_;
      auVar150._0_4_ = fVar124 * auVar38._0_4_;
      fVar136 = auVar40._4_4_;
      auVar150._4_4_ = fVar136 * auVar38._4_4_;
      fVar137 = auVar40._8_4_;
      auVar150._8_4_ = fVar137 * auVar38._8_4_;
      fVar228 = auVar40._12_4_;
      auVar150._12_4_ = fVar228 * auVar38._12_4_;
      auVar38 = vfmsub231ps_avx512vl(auVar150,auVar37,auVar44);
      auVar39 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar38 = vshufps_avx512vl(auVar43,auVar43,0xc9);
      auVar169._0_4_ = fVar124 * auVar38._0_4_;
      auVar169._4_4_ = fVar136 * auVar38._4_4_;
      auVar169._8_4_ = fVar137 * auVar38._8_4_;
      auVar169._12_4_ = fVar228 * auVar38._12_4_;
      auVar37 = vfmsub231ps_avx512vl(auVar169,auVar37,auVar43);
      auVar46 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar37 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar38 = vshufps_avx(auVar48,auVar48,0xc9);
      fVar231 = auVar47._0_4_;
      auVar186._0_4_ = auVar38._0_4_ * fVar231;
      fVar216 = auVar47._4_4_;
      auVar186._4_4_ = auVar38._4_4_ * fVar216;
      fVar226 = auVar47._8_4_;
      auVar186._8_4_ = auVar38._8_4_ * fVar226;
      fVar227 = auVar47._12_4_;
      auVar186._12_4_ = auVar38._12_4_ * fVar227;
      auVar38 = vfmsub231ps_fma(auVar186,auVar37,auVar48);
      auVar52 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar38 = vshufps_avx(auVar49,auVar49,0xc9);
      auVar187._0_4_ = auVar38._0_4_ * fVar231;
      auVar187._4_4_ = auVar38._4_4_ * fVar216;
      auVar187._8_4_ = auVar38._8_4_ * fVar226;
      auVar187._12_4_ = auVar38._12_4_ * fVar227;
      auVar37 = vfmsub231ps_fma(auVar187,auVar37,auVar49);
      auVar49 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar37 = vdpps_avx(auVar39,auVar39,0x7f);
      auVar81._16_16_ = auVar85._16_16_;
      auVar66._4_28_ = auVar81._4_28_;
      auVar66._0_4_ = auVar37._0_4_;
      auVar38 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar66._0_16_);
      auVar50 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
      auVar51 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
      auVar51 = vmulss_avx512f(auVar51,auVar38);
      auVar38 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar38._0_4_ * auVar38._0_4_)));
      auVar38 = vaddss_avx512f(auVar50,auVar38);
      auVar196._0_4_ = auVar38._0_4_;
      auVar196._4_4_ = auVar196._0_4_;
      auVar196._8_4_ = auVar196._0_4_;
      auVar196._12_4_ = auVar196._0_4_;
      auVar50 = vmulps_avx512vl(auVar39,auVar196);
      auVar38 = vdpps_avx(auVar39,auVar46,0x7f);
      auVar51 = vbroadcastss_avx512vl(auVar37);
      auVar46 = vmulps_avx512vl(auVar51,auVar46);
      fVar99 = auVar38._0_4_;
      auVar151._0_4_ = fVar99 * auVar39._0_4_;
      auVar151._4_4_ = fVar99 * auVar39._4_4_;
      auVar151._8_4_ = fVar99 * auVar39._8_4_;
      auVar151._12_4_ = fVar99 * auVar39._12_4_;
      auVar39 = vsubps_avx(auVar46,auVar151);
      auVar38 = vrcp14ss_avx512f(auVar81._0_16_,auVar66._0_16_);
      auVar37 = vfnmadd213ss_avx512f(auVar37,auVar38,ZEXT416(0x40000000));
      fVar143 = auVar38._0_4_ * auVar37._0_4_;
      auVar37 = vdpps_avx(auVar52,auVar52,0x7f);
      auVar84._16_16_ = auVar85._16_16_;
      auVar84._0_16_ = auVar81._0_16_;
      auVar67._4_28_ = auVar84._4_28_;
      auVar67._0_4_ = auVar37._0_4_;
      auVar38 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar67._0_16_);
      auVar46 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
      auVar51 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
      fVar99 = auVar38._0_4_;
      fVar99 = auVar46._0_4_ + auVar51._0_4_ * fVar99 * fVar99 * fVar99;
      auVar197._0_4_ = fVar99 * auVar52._0_4_;
      auVar197._4_4_ = fVar99 * auVar52._4_4_;
      auVar197._8_4_ = fVar99 * auVar52._8_4_;
      auVar197._12_4_ = fVar99 * auVar52._12_4_;
      auVar38 = vdpps_avx(auVar52,auVar49,0x7f);
      auVar46 = vbroadcastss_avx512vl(auVar37);
      auVar46 = vmulps_avx512vl(auVar46,auVar49);
      fVar210 = auVar38._0_4_;
      auVar102._0_4_ = fVar210 * auVar52._0_4_;
      auVar102._4_4_ = fVar210 * auVar52._4_4_;
      auVar102._8_4_ = fVar210 * auVar52._8_4_;
      auVar102._12_4_ = fVar210 * auVar52._12_4_;
      auVar38 = vsubps_avx(auVar46,auVar102);
      auVar46 = vrcp14ss_avx512f(auVar81._0_16_,auVar67._0_16_);
      auVar37 = vfnmadd213ss_avx512f(auVar37,auVar46,ZEXT416(0x40000000));
      fVar210 = auVar46._0_4_ * auVar37._0_4_;
      auVar46 = vshufps_avx512vl(auVar41,auVar41,0xff);
      auVar52 = vmulps_avx512vl(auVar46,auVar50);
      auVar51 = vsubps_avx512vl(auVar41,auVar52);
      auVar37 = vshufps_avx(auVar40,auVar40,0xff);
      auVar37 = vmulps_avx512vl(auVar37,auVar50);
      auVar140._0_4_ = auVar37._0_4_ + auVar46._0_4_ * auVar196._0_4_ * fVar143 * auVar39._0_4_;
      auVar140._4_4_ = auVar37._4_4_ + auVar46._4_4_ * auVar196._0_4_ * fVar143 * auVar39._4_4_;
      auVar140._8_4_ = auVar37._8_4_ + auVar46._8_4_ * auVar196._0_4_ * fVar143 * auVar39._8_4_;
      auVar140._12_4_ = auVar37._12_4_ + auVar46._12_4_ * auVar196._0_4_ * fVar143 * auVar39._12_4_;
      auVar37 = vsubps_avx(auVar40,auVar140);
      auVar50 = vaddps_avx512vl(auVar41,auVar52);
      auVar39 = vshufps_avx512vl(auVar45,auVar45,0xff);
      auVar243._0_4_ = auVar197._0_4_ * auVar39._0_4_;
      auVar243._4_4_ = auVar197._4_4_ * auVar39._4_4_;
      auVar243._8_4_ = auVar197._8_4_ * auVar39._8_4_;
      auVar243._12_4_ = auVar197._12_4_ * auVar39._12_4_;
      auVar40 = vsubps_avx512vl(auVar45,auVar243);
      auVar46 = vshufps_avx512vl(auVar47,auVar47,0xff);
      auVar46 = vmulps_avx512vl(auVar46,auVar197);
      auVar152._0_4_ = auVar46._0_4_ + auVar39._0_4_ * fVar99 * auVar38._0_4_ * fVar210;
      auVar152._4_4_ = auVar46._4_4_ + auVar39._4_4_ * fVar99 * auVar38._4_4_ * fVar210;
      auVar152._8_4_ = auVar46._8_4_ + auVar39._8_4_ * fVar99 * auVar38._8_4_ * fVar210;
      auVar152._12_4_ = auVar46._12_4_ + auVar39._12_4_ * fVar99 * auVar38._12_4_ * fVar210;
      auVar38 = vsubps_avx(auVar47,auVar152);
      auVar41 = vaddps_avx512vl(auVar45,auVar243);
      auVar181._0_4_ = auVar51._0_4_ + auVar37._0_4_ * 0.33333334;
      auVar181._4_4_ = auVar51._4_4_ + auVar37._4_4_ * 0.33333334;
      auVar181._8_4_ = auVar51._8_4_ + auVar37._8_4_ * 0.33333334;
      auVar181._12_4_ = auVar51._12_4_ + auVar37._12_4_ * 0.33333334;
      auVar153._0_4_ = auVar38._0_4_ * 0.33333334;
      auVar153._4_4_ = auVar38._4_4_ * 0.33333334;
      auVar153._8_4_ = auVar38._8_4_ * 0.33333334;
      auVar153._12_4_ = auVar38._12_4_ * 0.33333334;
      auVar52 = vsubps_avx(auVar40,auVar153);
      auVar154._0_4_ = (fVar124 + auVar140._0_4_) * 0.33333334;
      auVar154._4_4_ = (fVar136 + auVar140._4_4_) * 0.33333334;
      auVar154._8_4_ = (fVar137 + auVar140._8_4_) * 0.33333334;
      auVar154._12_4_ = (fVar228 + auVar140._12_4_) * 0.33333334;
      auVar43 = vaddps_avx512vl(auVar50,auVar154);
      auVar170._0_4_ = (fVar231 + auVar152._0_4_) * 0.33333334;
      auVar170._4_4_ = (fVar216 + auVar152._4_4_) * 0.33333334;
      auVar170._8_4_ = (fVar226 + auVar152._8_4_) * 0.33333334;
      auVar170._12_4_ = (fVar227 + auVar152._12_4_) * 0.33333334;
      auVar49 = vsubps_avx(auVar41,auVar170);
      auVar37 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
      auVar38 = vmulps_avx512vl(auVar57,auVar81._0_16_);
      auVar39 = vfmadd213ps_avx512vl(auVar108,auVar56,auVar38);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar54,auVar42);
      auVar44 = vfmadd231ps_avx512vl(auVar39,auVar53,auVar108);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar56,auVar65);
      auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar54,auVar81._0_16_);
      auVar45 = vfnmadd231ps_avx512vl(auVar38,auVar53,auVar65);
      auVar38 = vmulps_avx512vl(auVar37,auVar81._0_16_);
      auVar39 = vfmadd213ps_avx512vl(auVar108,auVar55,auVar38);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar59,auVar42);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar58,auVar108);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar55,auVar65);
      auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar59,auVar81._0_16_);
      auVar46 = vfnmadd231ps_avx512vl(auVar38,auVar58,auVar65);
      auVar38 = vmulps_avx512vl(auVar57,auVar108);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar56,auVar42);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar54,auVar108);
      auVar47 = vfmadd231ps_avx512vl(auVar38,auVar53,auVar81._0_16_);
      auVar38 = vmulps_avx512vl(auVar57,auVar65);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar81._0_16_,auVar56);
      auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar65,auVar54);
      auVar53 = vfnmadd231ps_avx512vl(auVar38,auVar81._0_16_,auVar53);
      auVar38 = vmulps_avx512vl(auVar37,auVar108);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar55,auVar42);
      auVar38 = vfmadd231ps_fma(auVar38,auVar59,auVar108);
      auVar54 = vfmadd231ps_avx512vl(auVar38,auVar58,auVar81._0_16_);
      auVar37 = vmulps_avx512vl(auVar37,auVar65);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar81._0_16_,auVar55);
      auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar65,auVar59);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar56 = vfnmadd231ps_avx512vl(auVar37,auVar81._0_16_,auVar58);
      auVar37 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar38 = vshufps_avx512vl(auVar39,auVar39,0xc9);
      fVar216 = auVar45._0_4_;
      auVar250._0_4_ = fVar216 * auVar38._0_4_;
      fVar226 = auVar45._4_4_;
      auVar250._4_4_ = fVar226 * auVar38._4_4_;
      fVar227 = auVar45._8_4_;
      auVar250._8_4_ = fVar227 * auVar38._8_4_;
      fVar143 = auVar45._12_4_;
      auVar250._12_4_ = fVar143 * auVar38._12_4_;
      auVar38 = vfmsub231ps_avx512vl(auVar250,auVar37,auVar39);
      auVar39 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar38 = vshufps_avx512vl(auVar46,auVar46,0xc9);
      auVar256._0_4_ = fVar216 * auVar38._0_4_;
      auVar256._4_4_ = fVar226 * auVar38._4_4_;
      auVar256._8_4_ = fVar227 * auVar38._8_4_;
      auVar256._12_4_ = fVar143 * auVar38._12_4_;
      auVar37 = vfmsub231ps_avx512vl(auVar256,auVar37,auVar46);
      auVar46 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar38 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar37 = vshufps_avx512vl(auVar54,auVar54,0xc9);
      auVar37 = vmulps_avx512vl(auVar53,auVar37);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar38,auVar54);
      auVar54 = vshufps_avx512vl(auVar37,auVar37,0xc9);
      auVar57 = vshufps_avx512vl(auVar56,auVar56,0xc9);
      auVar37 = vdpps_avx(auVar39,auVar39,0x7f);
      auVar57 = vmulps_avx512vl(auVar53,auVar57);
      auVar38 = vfmsub231ps_avx512vl(auVar57,auVar38,auVar56);
      auVar56 = vshufps_avx512vl(auVar38,auVar38,0xc9);
      auVar68._16_16_ = auVar85._16_16_;
      auVar68._0_16_ = auVar81._0_16_;
      auVar69._4_28_ = auVar68._4_28_;
      auVar69._0_4_ = auVar37._0_4_;
      auVar38 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar69._0_16_);
      auVar57 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
      auVar58 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
      auVar58 = vmulss_avx512f(auVar58,auVar38);
      auVar38 = vmulss_avx512f(auVar38,auVar38);
      auVar38 = vmulss_avx512f(auVar58,auVar38);
      auVar38 = vaddss_avx512f(auVar57,auVar38);
      auVar57 = vbroadcastss_avx512vl(auVar38);
      auVar58 = vmulps_avx512vl(auVar39,auVar57);
      auVar38 = vdpps_avx(auVar39,auVar46,0x7f);
      auVar59 = vbroadcastss_avx512vl(auVar37);
      auVar46 = vmulps_avx512vl(auVar59,auVar46);
      fVar99 = auVar38._0_4_;
      auVar155._0_4_ = auVar39._0_4_ * fVar99;
      auVar155._4_4_ = auVar39._4_4_ * fVar99;
      auVar155._8_4_ = auVar39._8_4_ * fVar99;
      auVar155._12_4_ = auVar39._12_4_ * fVar99;
      auVar38 = vsubps_avx(auVar46,auVar155);
      auVar39 = vrcp14ss_avx512f(auVar81._0_16_,auVar69._0_16_);
      auVar37 = vfnmadd213ss_avx512f(auVar37,auVar39,ZEXT416(0x40000000));
      fVar99 = auVar39._0_4_ * auVar37._0_4_;
      auVar37 = vdpps_avx(auVar54,auVar54,0x7f);
      auVar109._0_4_ = fVar99 * auVar38._0_4_;
      auVar109._4_4_ = fVar99 * auVar38._4_4_;
      auVar109._8_4_ = fVar99 * auVar38._8_4_;
      auVar109._12_4_ = fVar99 * auVar38._12_4_;
      auVar39 = vmulps_avx512vl(auVar57,auVar109);
      auVar70._16_16_ = auVar85._16_16_;
      auVar70._0_16_ = auVar81._0_16_;
      auVar71._4_28_ = auVar70._4_28_;
      auVar71._0_4_ = auVar37._0_4_;
      auVar38 = vrsqrt14ss_avx512f(auVar81._0_16_,auVar71._0_16_);
      auVar46 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
      auVar269 = ZEXT464(0x3f800000);
      auVar57 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
      auVar57 = vmulss_avx512f(auVar57,auVar38);
      auVar38 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar38._0_4_ * auVar38._0_4_)));
      fVar99 = auVar46._0_4_ + auVar38._0_4_;
      auVar257._0_4_ = auVar54._0_4_ * fVar99;
      auVar257._4_4_ = auVar54._4_4_ * fVar99;
      auVar257._8_4_ = auVar54._8_4_ * fVar99;
      auVar257._12_4_ = auVar54._12_4_ * fVar99;
      auVar38 = vdpps_avx(auVar54,auVar56,0x7f);
      auVar46 = vbroadcastss_avx512vl(auVar37);
      auVar46 = vmulps_avx512vl(auVar46,auVar56);
      fVar231 = auVar38._0_4_;
      auVar171._0_4_ = auVar54._0_4_ * fVar231;
      auVar171._4_4_ = auVar54._4_4_ * fVar231;
      auVar171._8_4_ = auVar54._8_4_ * fVar231;
      auVar171._12_4_ = auVar54._12_4_ * fVar231;
      auVar38 = vsubps_avx(auVar46,auVar171);
      auVar46 = vrcp14ss_avx512f(auVar81._0_16_,auVar71._0_16_);
      auVar37 = vfnmadd213ss_avx512f(auVar37,auVar46,ZEXT416(0x40000000));
      fVar231 = auVar37._0_4_ * auVar46._0_4_;
      auVar46 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar54 = vmulps_avx512vl(auVar46,auVar58);
      auVar56 = vsubps_avx512vl(auVar44,auVar54);
      auVar37 = vshufps_avx(auVar45,auVar45,0xff);
      auVar37 = vmulps_avx512vl(auVar37,auVar58);
      auVar110._0_4_ = auVar37._0_4_ + auVar46._0_4_ * auVar39._0_4_;
      auVar110._4_4_ = auVar37._4_4_ + auVar46._4_4_ * auVar39._4_4_;
      auVar110._8_4_ = auVar37._8_4_ + auVar46._8_4_ * auVar39._8_4_;
      auVar110._12_4_ = auVar37._12_4_ + auVar46._12_4_ * auVar39._12_4_;
      auVar37 = vsubps_avx(auVar45,auVar110);
      auVar39 = vaddps_avx512vl(auVar44,auVar54);
      auVar46 = vshufps_avx512vl(auVar47,auVar47,0xff);
      auVar233._0_4_ = auVar46._0_4_ * auVar257._0_4_;
      auVar233._4_4_ = auVar46._4_4_ * auVar257._4_4_;
      auVar233._8_4_ = auVar46._8_4_ * auVar257._8_4_;
      auVar233._12_4_ = auVar46._12_4_ * auVar257._12_4_;
      auVar54 = vsubps_avx512vl(auVar47,auVar233);
      auVar57 = vshufps_avx512vl(auVar53,auVar53,0xff);
      auVar57 = vmulps_avx512vl(auVar57,auVar257);
      auVar156._0_4_ = auVar57._0_4_ + auVar46._0_4_ * fVar99 * auVar38._0_4_ * fVar231;
      auVar156._4_4_ = auVar57._4_4_ + auVar46._4_4_ * fVar99 * auVar38._4_4_ * fVar231;
      auVar156._8_4_ = auVar57._8_4_ + auVar46._8_4_ * fVar99 * auVar38._8_4_ * fVar231;
      auVar156._12_4_ = auVar57._12_4_ + auVar46._12_4_ * fVar99 * auVar38._12_4_ * fVar231;
      auVar38 = vsubps_avx(auVar53,auVar156);
      auVar46 = vaddps_avx512vl(auVar47,auVar233);
      auVar172._0_4_ = auVar56._0_4_ + auVar37._0_4_ * 0.33333334;
      auVar172._4_4_ = auVar56._4_4_ + auVar37._4_4_ * 0.33333334;
      auVar172._8_4_ = auVar56._8_4_ + auVar37._8_4_ * 0.33333334;
      auVar172._12_4_ = auVar56._12_4_ + auVar37._12_4_ * 0.33333334;
      auVar198._0_4_ = auVar38._0_4_ * 0.33333334;
      auVar198._4_4_ = auVar38._4_4_ * 0.33333334;
      auVar198._8_4_ = auVar38._8_4_ * 0.33333334;
      auVar198._12_4_ = auVar38._12_4_ * 0.33333334;
      auVar37 = vsubps_avx(auVar54,auVar198);
      auVar111._0_4_ = auVar39._0_4_ + (fVar216 + auVar110._0_4_) * 0.33333334;
      auVar111._4_4_ = auVar39._4_4_ + (fVar226 + auVar110._4_4_) * 0.33333334;
      auVar111._8_4_ = auVar39._8_4_ + (fVar227 + auVar110._8_4_) * 0.33333334;
      auVar111._12_4_ = auVar39._12_4_ + (fVar143 + auVar110._12_4_) * 0.33333334;
      auVar157._0_4_ = (auVar53._0_4_ + auVar156._0_4_) * 0.33333334;
      auVar157._4_4_ = (auVar53._4_4_ + auVar156._4_4_) * 0.33333334;
      auVar157._8_4_ = (auVar53._8_4_ + auVar156._8_4_) * 0.33333334;
      auVar157._12_4_ = (auVar53._12_4_ + auVar156._12_4_) * 0.33333334;
      auVar38 = vsubps_avx(auVar46,auVar157);
      auVar244._4_4_ = fVar138;
      auVar244._0_4_ = fVar138;
      auVar244._8_4_ = fVar138;
      auVar244._12_4_ = fVar138;
      auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar138));
      auVar258._0_4_ = auVar53._0_4_;
      auVar258._4_4_ = auVar258._0_4_;
      auVar258._8_4_ = auVar258._0_4_;
      auVar258._12_4_ = auVar258._0_4_;
      auVar53 = vmulps_avx512vl(auVar244,auVar56);
      auVar56 = vmulps_avx512vl(auVar244,auVar172);
      auVar37 = vmulps_avx512vl(auVar244,auVar37);
      auVar251._0_4_ = fVar138 * auVar54._0_4_;
      auVar251._4_4_ = fVar138 * auVar54._4_4_;
      auVar251._8_4_ = fVar138 * auVar54._8_4_;
      auVar251._12_4_ = fVar138 * auVar54._12_4_;
      local_208 = vfmadd231ps_avx512vl(auVar53,auVar258,auVar51);
      local_218 = vfmadd231ps_avx512vl(auVar56,auVar258,auVar181);
      local_228 = vfmadd231ps_avx512vl(auVar37,auVar258,auVar52);
      local_238 = vfmadd231ps_fma(auVar251,auVar258,auVar40);
      auVar37 = vmulps_avx512vl(auVar244,auVar39);
      auVar39 = vmulps_avx512vl(auVar244,auVar111);
      auVar38 = vmulps_avx512vl(auVar244,auVar38);
      auVar245._0_4_ = fVar138 * auVar46._0_4_;
      auVar245._4_4_ = fVar138 * auVar46._4_4_;
      auVar245._8_4_ = fVar138 * auVar46._8_4_;
      auVar245._12_4_ = fVar138 * auVar46._12_4_;
      _local_248 = vfmadd231ps_avx512vl(auVar37,auVar258,auVar50);
      _local_258 = vfmadd231ps_avx512vl(auVar39,auVar258,auVar43);
      _local_268 = vfmadd231ps_avx512vl(auVar38,auVar258,auVar49);
      _local_278 = vfmadd231ps_fma(auVar245,auVar258,auVar41);
      auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      local_188 = vsubps_avx512vl(local_208,auVar37);
      uVar100 = local_188._0_4_;
      auVar112._4_4_ = uVar100;
      auVar112._0_4_ = uVar100;
      auVar112._8_4_ = uVar100;
      auVar112._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_188,local_188,0x55);
      auVar39 = vshufps_avx(local_188,local_188,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar99 = pre->ray_space[k].vz.field_0.m128[0];
      fVar231 = pre->ray_space[k].vz.field_0.m128[1];
      fVar216 = pre->ray_space[k].vz.field_0.m128[2];
      fVar226 = pre->ray_space[k].vz.field_0.m128[3];
      auVar103._0_4_ = fVar99 * auVar39._0_4_;
      auVar103._4_4_ = fVar231 * auVar39._4_4_;
      auVar103._8_4_ = fVar216 * auVar39._8_4_;
      auVar103._12_4_ = fVar226 * auVar39._12_4_;
      auVar38 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar38);
      auVar50 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar112);
      local_198 = vsubps_avx512vl(local_218,auVar37);
      uVar100 = local_198._0_4_;
      auVar125._4_4_ = uVar100;
      auVar125._0_4_ = uVar100;
      auVar125._8_4_ = uVar100;
      auVar125._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_198,local_198,0x55);
      auVar39 = vshufps_avx(local_198,local_198,0xaa);
      auVar113._0_4_ = fVar99 * auVar39._0_4_;
      auVar113._4_4_ = fVar231 * auVar39._4_4_;
      auVar113._8_4_ = fVar216 * auVar39._8_4_;
      auVar113._12_4_ = fVar226 * auVar39._12_4_;
      auVar38 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar38);
      auVar51 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar125);
      local_1a8 = vsubps_avx512vl(local_228,auVar37);
      uVar100 = local_1a8._0_4_;
      auVar126._4_4_ = uVar100;
      auVar126._0_4_ = uVar100;
      auVar126._8_4_ = uVar100;
      auVar126._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_1a8,local_1a8,0x55);
      auVar39 = vshufps_avx(local_1a8,local_1a8,0xaa);
      auVar188._0_4_ = auVar39._0_4_ * fVar99;
      auVar188._4_4_ = auVar39._4_4_ * fVar231;
      auVar188._8_4_ = auVar39._8_4_ * fVar216;
      auVar188._12_4_ = auVar39._12_4_ * fVar226;
      auVar38 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar4,auVar38);
      auVar53 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar126);
      local_1b8 = vsubps_avx(local_238,auVar37);
      uVar100 = local_1b8._0_4_;
      auVar127._4_4_ = uVar100;
      auVar127._0_4_ = uVar100;
      auVar127._8_4_ = uVar100;
      auVar127._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_1b8,local_1b8,0x55);
      auVar39 = vshufps_avx(local_1b8,local_1b8,0xaa);
      auVar199._0_4_ = auVar39._0_4_ * fVar99;
      auVar199._4_4_ = auVar39._4_4_ * fVar231;
      auVar199._8_4_ = auVar39._8_4_ * fVar216;
      auVar199._12_4_ = auVar39._12_4_ * fVar226;
      auVar38 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar4,auVar38);
      auVar54 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar127);
      local_1c8 = vsubps_avx512vl(_local_248,auVar37);
      uVar100 = local_1c8._0_4_;
      auVar128._4_4_ = uVar100;
      auVar128._0_4_ = uVar100;
      auVar128._8_4_ = uVar100;
      auVar128._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_1c8,local_1c8,0x55);
      auVar39 = vshufps_avx(local_1c8,local_1c8,0xaa);
      auVar211._0_4_ = auVar39._0_4_ * fVar99;
      auVar211._4_4_ = auVar39._4_4_ * fVar231;
      auVar211._8_4_ = auVar39._8_4_ * fVar216;
      auVar211._12_4_ = auVar39._12_4_ * fVar226;
      auVar38 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar4,auVar38);
      auVar56 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar128);
      local_1d8 = vsubps_avx512vl(_local_258,auVar37);
      uVar100 = local_1d8._0_4_;
      auVar129._4_4_ = uVar100;
      auVar129._0_4_ = uVar100;
      auVar129._8_4_ = uVar100;
      auVar129._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_1d8,local_1d8,0x55);
      auVar39 = vshufps_avx(local_1d8,local_1d8,0xaa);
      auVar217._0_4_ = auVar39._0_4_ * fVar99;
      auVar217._4_4_ = auVar39._4_4_ * fVar231;
      auVar217._8_4_ = auVar39._8_4_ * fVar216;
      auVar217._12_4_ = auVar39._12_4_ * fVar226;
      auVar38 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar4,auVar38);
      auVar57 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar129);
      local_1e8 = vsubps_avx512vl(_local_268,auVar37);
      uVar100 = local_1e8._0_4_;
      auVar130._4_4_ = uVar100;
      auVar130._0_4_ = uVar100;
      auVar130._8_4_ = uVar100;
      auVar130._12_4_ = uVar100;
      auVar38 = vshufps_avx(local_1e8,local_1e8,0x55);
      auVar39 = vshufps_avx(local_1e8,local_1e8,0xaa);
      auVar234._0_4_ = auVar39._0_4_ * fVar99;
      auVar234._4_4_ = auVar39._4_4_ * fVar231;
      auVar234._8_4_ = auVar39._8_4_ * fVar216;
      auVar234._12_4_ = auVar39._12_4_ * fVar226;
      auVar38 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar4,auVar38);
      auVar58 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar130);
      local_1f8 = vsubps_avx(_local_278,auVar37);
      uVar100 = local_1f8._0_4_;
      auVar117._4_4_ = uVar100;
      auVar117._0_4_ = uVar100;
      auVar117._8_4_ = uVar100;
      auVar117._12_4_ = uVar100;
      auVar37 = vshufps_avx(local_1f8,local_1f8,0x55);
      auVar38 = vshufps_avx(local_1f8,local_1f8,0xaa);
      auVar173._0_4_ = fVar99 * auVar38._0_4_;
      auVar173._4_4_ = fVar231 * auVar38._4_4_;
      auVar173._8_4_ = fVar216 * auVar38._8_4_;
      auVar173._12_4_ = fVar226 * auVar38._12_4_;
      auVar37 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar4,auVar37);
      auVar59 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar117);
      auVar39 = vmovlhps_avx(auVar50,auVar56);
      auVar46 = vmovlhps_avx(auVar51,auVar57);
      auVar52 = vmovlhps_avx(auVar53,auVar58);
      _local_348 = vmovlhps_avx512f(auVar54,auVar59);
      auVar38 = vminps_avx(auVar39,auVar46);
      auVar37 = vmaxps_avx(auVar39,auVar46);
      auVar49 = vminps_avx512vl(auVar52,_local_348);
      auVar38 = vminps_avx(auVar38,auVar49);
      auVar49 = vmaxps_avx512vl(auVar52,_local_348);
      auVar37 = vmaxps_avx(auVar37,auVar49);
      auVar49 = vshufpd_avx(auVar38,auVar38,3);
      auVar38 = vminps_avx(auVar38,auVar49);
      auVar49 = vshufpd_avx(auVar37,auVar37,3);
      auVar37 = vmaxps_avx(auVar37,auVar49);
      auVar38 = vandps_avx512vl(auVar38,auVar267._0_16_);
      auVar37 = vandps_avx512vl(auVar37,auVar267._0_16_);
      auVar37 = vmaxps_avx(auVar38,auVar37);
      auVar38 = vmovshdup_avx(auVar37);
      auVar37 = vmaxss_avx(auVar38,auVar37);
      fVar99 = auVar37._0_4_ * 9.536743e-07;
      auVar38 = vmovddup_avx512vl(auVar50);
      auVar49 = vmovddup_avx512vl(auVar51);
      auVar189._0_8_ = auVar53._0_8_;
      auVar189._8_8_ = auVar189._0_8_;
      auVar200._0_8_ = auVar54._0_8_;
      auVar200._8_8_ = auVar200._0_8_;
      local_358 = ZEXT416((uint)fVar99);
      auVar114._4_4_ = fVar99;
      auVar114._0_4_ = fVar99;
      auVar114._8_4_ = fVar99;
      auVar114._12_4_ = fVar99;
      local_148._16_4_ = fVar99;
      local_148._0_16_ = auVar114;
      local_148._20_4_ = fVar99;
      local_148._24_4_ = fVar99;
      local_148._28_4_ = fVar99;
      auVar37 = vxorps_avx512vl(auVar114,auVar55);
      local_78 = auVar37._0_4_;
      uStack_74 = local_78;
      uStack_70 = local_78;
      uStack_6c = local_78;
      uStack_68 = local_78;
      uStack_64 = local_78;
      uStack_60 = local_78;
      uStack_5c = local_78;
      bVar29 = false;
      uVar23 = 0;
      fVar99 = *(float *)(ray + k * 4 + 0x30);
      local_158 = vsubps_avx(auVar46,auVar39);
      local_168 = vsubps_avx(auVar52,auVar46);
      local_178 = vsubps_avx512vl(_local_348,auVar52);
      local_2a8 = vsubps_avx512vl(_local_248,local_208);
      local_2b8 = vsubps_avx512vl(_local_258,local_218);
      local_2c8 = vsubps_avx512vl(_local_268,local_228);
      _local_2d8 = vsubps_avx(_local_278,local_238);
      local_2e8 = vpbroadcastd_avx512vl();
      auVar37 = ZEXT816(0x3f80000000000000);
      auVar115 = auVar37;
LAB_01bc6f9d:
      auVar50 = vshufps_avx(auVar115,auVar115,0x50);
      auVar252._8_4_ = 0x3f800000;
      auVar252._0_8_ = 0x3f8000003f800000;
      auVar252._12_4_ = 0x3f800000;
      auVar255._16_4_ = 0x3f800000;
      auVar255._0_16_ = auVar252;
      auVar255._20_4_ = 0x3f800000;
      auVar255._24_4_ = 0x3f800000;
      auVar255._28_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar252,auVar50);
      fVar231 = auVar50._0_4_;
      fVar138 = auVar56._0_4_;
      auVar141._0_4_ = fVar138 * fVar231;
      fVar216 = auVar50._4_4_;
      fVar143 = auVar56._4_4_;
      auVar141._4_4_ = fVar143 * fVar216;
      fVar226 = auVar50._8_4_;
      auVar141._8_4_ = fVar138 * fVar226;
      fVar227 = auVar50._12_4_;
      auVar141._12_4_ = fVar143 * fVar227;
      fVar210 = auVar57._0_4_;
      auVar158._0_4_ = fVar210 * fVar231;
      fVar124 = auVar57._4_4_;
      auVar158._4_4_ = fVar124 * fVar216;
      auVar158._8_4_ = fVar210 * fVar226;
      auVar158._12_4_ = fVar124 * fVar227;
      fVar136 = auVar58._0_4_;
      auVar174._0_4_ = fVar136 * fVar231;
      fVar137 = auVar58._4_4_;
      auVar174._4_4_ = fVar137 * fVar216;
      auVar174._8_4_ = fVar136 * fVar226;
      auVar174._12_4_ = fVar137 * fVar227;
      fVar232 = auVar59._0_4_;
      auVar118._0_4_ = fVar232 * fVar231;
      fVar242 = auVar59._4_4_;
      auVar118._4_4_ = fVar242 * fVar216;
      auVar118._8_4_ = fVar232 * fVar226;
      auVar118._12_4_ = fVar242 * fVar227;
      auVar54 = vfmadd231ps_avx512vl(auVar141,auVar51,auVar38);
      auVar55 = vfmadd231ps_avx512vl(auVar158,auVar51,auVar49);
      auVar53 = vfmadd231ps_fma(auVar174,auVar51,auVar189);
      auVar51 = vfmadd231ps_fma(auVar118,auVar200,auVar51);
      auVar50 = vmovshdup_avx(auVar37);
      fVar216 = auVar37._0_4_;
      fVar231 = (auVar50._0_4_ - fVar216) * 0.04761905;
      auVar164._4_4_ = fVar216;
      auVar164._0_4_ = fVar216;
      auVar164._8_4_ = fVar216;
      auVar164._12_4_ = fVar216;
      auVar164._16_4_ = fVar216;
      auVar164._20_4_ = fVar216;
      auVar164._24_4_ = fVar216;
      auVar164._28_4_ = fVar216;
      auVar76._0_8_ = auVar50._0_8_;
      auVar76._8_8_ = auVar76._0_8_;
      auVar76._16_8_ = auVar76._0_8_;
      auVar76._24_8_ = auVar76._0_8_;
      auVar85 = vsubps_avx(auVar76,auVar164);
      uVar100 = auVar54._0_4_;
      auVar135._4_4_ = uVar100;
      auVar135._0_4_ = uVar100;
      auVar135._8_4_ = uVar100;
      auVar135._12_4_ = uVar100;
      auVar135._16_4_ = uVar100;
      auVar135._20_4_ = uVar100;
      auVar135._24_4_ = uVar100;
      auVar135._28_4_ = uVar100;
      auVar77._8_4_ = 1;
      auVar77._0_8_ = 0x100000001;
      auVar77._12_4_ = 1;
      auVar77._16_4_ = 1;
      auVar77._20_4_ = 1;
      auVar77._24_4_ = 1;
      auVar77._28_4_ = 1;
      auVar84 = ZEXT1632(auVar54);
      auVar81 = vpermps_avx2(auVar77,auVar84);
      auVar66 = vbroadcastss_avx512vl(auVar55);
      auVar82 = ZEXT1632(auVar55);
      auVar67 = vpermps_avx512vl(auVar77,auVar82);
      auVar68 = vbroadcastss_avx512vl(auVar53);
      auVar83 = ZEXT1632(auVar53);
      auVar69 = vpermps_avx512vl(auVar77,auVar83);
      auVar70 = vbroadcastss_avx512vl(auVar51);
      auVar80 = ZEXT1632(auVar51);
      auVar71 = vpermps_avx512vl(auVar77,auVar80);
      auVar214._4_4_ = fVar231;
      auVar214._0_4_ = fVar231;
      auVar214._8_4_ = fVar231;
      auVar214._12_4_ = fVar231;
      auVar214._16_4_ = fVar231;
      auVar214._20_4_ = fVar231;
      auVar214._24_4_ = fVar231;
      auVar214._28_4_ = fVar231;
      auVar78._8_4_ = 2;
      auVar78._0_8_ = 0x200000002;
      auVar78._12_4_ = 2;
      auVar78._16_4_ = 2;
      auVar78._20_4_ = 2;
      auVar78._24_4_ = 2;
      auVar78._28_4_ = 2;
      auVar72 = vpermps_avx512vl(auVar78,auVar84);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar74 = vpermps_avx512vl(auVar73,auVar84);
      auVar75 = vpermps_avx512vl(auVar78,auVar82);
      auVar76 = vpermps_avx512vl(auVar73,auVar82);
      auVar84 = vpermps_avx2(auVar78,auVar83);
      auVar77 = vpermps_avx512vl(auVar73,auVar83);
      auVar78 = vpermps_avx512vl(auVar78,auVar80);
      auVar79 = vpermps_avx512vl(auVar73,auVar80);
      auVar50 = vfmadd132ps_fma(auVar85,auVar164,_DAT_01faff20);
      auVar85 = vsubps_avx(auVar255,ZEXT1632(auVar50));
      auVar73 = vmulps_avx512vl(auVar66,ZEXT1632(auVar50));
      auVar82 = ZEXT1632(auVar50);
      auVar80 = vmulps_avx512vl(auVar67,auVar82);
      auVar51 = vfmadd231ps_fma(auVar73,auVar85,auVar135);
      auVar53 = vfmadd231ps_fma(auVar80,auVar85,auVar81);
      auVar73 = vmulps_avx512vl(auVar68,auVar82);
      auVar80 = vmulps_avx512vl(auVar69,auVar82);
      auVar66 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar66);
      auVar67 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar67);
      auVar73 = vmulps_avx512vl(auVar70,auVar82);
      auVar135 = ZEXT1632(auVar50);
      auVar71 = vmulps_avx512vl(auVar71,auVar135);
      auVar68 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar68);
      auVar69 = vfmadd231ps_avx512vl(auVar71,auVar85,auVar69);
      fVar226 = auVar50._0_4_;
      fVar227 = auVar50._4_4_;
      auVar73._4_4_ = fVar227 * auVar66._4_4_;
      auVar73._0_4_ = fVar226 * auVar66._0_4_;
      fVar228 = auVar50._8_4_;
      auVar73._8_4_ = fVar228 * auVar66._8_4_;
      fVar229 = auVar50._12_4_;
      auVar73._12_4_ = fVar229 * auVar66._12_4_;
      auVar73._16_4_ = auVar66._16_4_ * 0.0;
      auVar73._20_4_ = auVar66._20_4_ * 0.0;
      auVar73._24_4_ = auVar66._24_4_ * 0.0;
      auVar73._28_4_ = fVar216;
      auVar80._4_4_ = fVar227 * auVar67._4_4_;
      auVar80._0_4_ = fVar226 * auVar67._0_4_;
      auVar80._8_4_ = fVar228 * auVar67._8_4_;
      auVar80._12_4_ = fVar229 * auVar67._12_4_;
      auVar80._16_4_ = auVar67._16_4_ * 0.0;
      auVar80._20_4_ = auVar67._20_4_ * 0.0;
      auVar80._24_4_ = auVar67._24_4_ * 0.0;
      auVar80._28_4_ = auVar81._28_4_;
      auVar51 = vfmadd231ps_fma(auVar73,auVar85,ZEXT1632(auVar51));
      auVar53 = vfmadd231ps_fma(auVar80,auVar85,ZEXT1632(auVar53));
      auVar86._0_4_ = fVar226 * auVar68._0_4_;
      auVar86._4_4_ = fVar227 * auVar68._4_4_;
      auVar86._8_4_ = fVar228 * auVar68._8_4_;
      auVar86._12_4_ = fVar229 * auVar68._12_4_;
      auVar86._16_4_ = auVar68._16_4_ * 0.0;
      auVar86._20_4_ = auVar68._20_4_ * 0.0;
      auVar86._24_4_ = auVar68._24_4_ * 0.0;
      auVar86._28_4_ = 0;
      auVar82._4_4_ = fVar227 * auVar69._4_4_;
      auVar82._0_4_ = fVar226 * auVar69._0_4_;
      auVar82._8_4_ = fVar228 * auVar69._8_4_;
      auVar82._12_4_ = fVar229 * auVar69._12_4_;
      auVar82._16_4_ = auVar69._16_4_ * 0.0;
      auVar82._20_4_ = auVar69._20_4_ * 0.0;
      auVar82._24_4_ = auVar69._24_4_ * 0.0;
      auVar82._28_4_ = auVar68._28_4_;
      auVar54 = vfmadd231ps_fma(auVar86,auVar85,auVar66);
      auVar55 = vfmadd231ps_fma(auVar82,auVar85,auVar67);
      auVar83._28_4_ = auVar67._28_4_;
      auVar83._0_28_ =
           ZEXT1628(CONCAT412(fVar229 * auVar55._12_4_,
                              CONCAT48(fVar228 * auVar55._8_4_,
                                       CONCAT44(fVar227 * auVar55._4_4_,fVar226 * auVar55._0_4_))));
      auVar40 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar229 * auVar54._12_4_,
                                                   CONCAT48(fVar228 * auVar54._8_4_,
                                                            CONCAT44(fVar227 * auVar54._4_4_,
                                                                     fVar226 * auVar54._0_4_)))),
                                auVar85,ZEXT1632(auVar51));
      auVar41 = vfmadd231ps_fma(auVar83,auVar85,ZEXT1632(auVar53));
      auVar81 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar51));
      auVar66 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar53));
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar81 = vmulps_avx512vl(auVar81,auVar67);
      auVar66 = vmulps_avx512vl(auVar66,auVar67);
      auVar209._0_4_ = fVar231 * auVar81._0_4_;
      auVar209._4_4_ = fVar231 * auVar81._4_4_;
      auVar209._8_4_ = fVar231 * auVar81._8_4_;
      auVar209._12_4_ = fVar231 * auVar81._12_4_;
      auVar209._16_4_ = fVar231 * auVar81._16_4_;
      auVar209._20_4_ = fVar231 * auVar81._20_4_;
      auVar209._24_4_ = fVar231 * auVar81._24_4_;
      auVar209._28_4_ = 0;
      auVar81 = vmulps_avx512vl(auVar214,auVar66);
      auVar53 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
      auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01feed00,ZEXT1632(auVar53));
      auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01feed00,ZEXT1632(auVar53));
      auVar123._0_4_ = auVar209._0_4_ + auVar40._0_4_;
      auVar123._4_4_ = auVar209._4_4_ + auVar40._4_4_;
      auVar123._8_4_ = auVar209._8_4_ + auVar40._8_4_;
      auVar123._12_4_ = auVar209._12_4_ + auVar40._12_4_;
      auVar123._16_4_ = auVar209._16_4_ + 0.0;
      auVar123._20_4_ = auVar209._20_4_ + 0.0;
      auVar123._24_4_ = auVar209._24_4_ + 0.0;
      auVar123._28_4_ = 0;
      auVar86 = ZEXT1632(auVar53);
      auVar69 = vpermt2ps_avx512vl(auVar209,_DAT_01feed00,auVar86);
      auVar70 = vaddps_avx512vl(ZEXT1632(auVar41),auVar81);
      auVar71 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar86);
      auVar81 = vsubps_avx(auVar66,auVar69);
      auVar69 = vsubps_avx512vl(auVar68,auVar71);
      auVar71 = vmulps_avx512vl(auVar75,auVar135);
      auVar73 = vmulps_avx512vl(auVar76,auVar135);
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar85,auVar72);
      auVar73 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar74);
      auVar80 = vmulps_avx512vl(auVar84,auVar135);
      auVar82 = vmulps_avx512vl(auVar77,auVar135);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar75);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar85,auVar76);
      auVar83 = vmulps_avx512vl(auVar78,auVar135);
      auVar72 = vmulps_avx512vl(auVar79,auVar135);
      auVar51 = vfmadd231ps_fma(auVar83,auVar85,auVar84);
      auVar84 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar77);
      auVar83 = vmulps_avx512vl(auVar135,auVar80);
      auVar74 = ZEXT1632(auVar50);
      auVar72 = vmulps_avx512vl(auVar74,auVar82);
      auVar71 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar71);
      auVar73 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar73);
      auVar84 = vmulps_avx512vl(auVar74,auVar84);
      auVar80 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar229 * auVar51._12_4_,
                                              CONCAT48(fVar228 * auVar51._8_4_,
                                                       CONCAT44(fVar227 * auVar51._4_4_,
                                                                fVar226 * auVar51._0_4_)))),auVar85,
                           auVar80);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar85,auVar82);
      auVar72._4_4_ = fVar227 * auVar80._4_4_;
      auVar72._0_4_ = fVar226 * auVar80._0_4_;
      auVar72._8_4_ = fVar228 * auVar80._8_4_;
      auVar72._12_4_ = fVar229 * auVar80._12_4_;
      auVar72._16_4_ = auVar80._16_4_ * 0.0;
      auVar72._20_4_ = auVar80._20_4_ * 0.0;
      auVar72._24_4_ = auVar80._24_4_ * 0.0;
      auVar72._28_4_ = auVar77._28_4_;
      auVar82 = vmulps_avx512vl(auVar74,auVar84);
      auVar83 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar71);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar85);
      auVar85 = vsubps_avx512vl(auVar80,auVar71);
      auVar84 = vsubps_avx512vl(auVar84,auVar73);
      auVar85 = vmulps_avx512vl(auVar85,auVar67);
      auVar84 = vmulps_avx512vl(auVar84,auVar67);
      fVar216 = fVar231 * auVar85._0_4_;
      fVar226 = fVar231 * auVar85._4_4_;
      auVar74._4_4_ = fVar226;
      auVar74._0_4_ = fVar216;
      fVar227 = fVar231 * auVar85._8_4_;
      auVar74._8_4_ = fVar227;
      fVar228 = fVar231 * auVar85._12_4_;
      auVar74._12_4_ = fVar228;
      fVar229 = fVar231 * auVar85._16_4_;
      auVar74._16_4_ = fVar229;
      fVar230 = fVar231 * auVar85._20_4_;
      auVar74._20_4_ = fVar230;
      fVar231 = fVar231 * auVar85._24_4_;
      auVar74._24_4_ = fVar231;
      auVar74._28_4_ = auVar85._28_4_;
      auVar84 = vmulps_avx512vl(auVar214,auVar84);
      auVar67 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar86);
      auVar71 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,auVar86);
      auVar215._0_4_ = auVar83._0_4_ + fVar216;
      auVar215._4_4_ = auVar83._4_4_ + fVar226;
      auVar215._8_4_ = auVar83._8_4_ + fVar227;
      auVar215._12_4_ = auVar83._12_4_ + fVar228;
      auVar215._16_4_ = auVar83._16_4_ + fVar229;
      auVar215._20_4_ = auVar83._20_4_ + fVar230;
      auVar215._24_4_ = auVar83._24_4_ + fVar231;
      auVar215._28_4_ = auVar83._28_4_ + auVar85._28_4_;
      auVar85 = vpermt2ps_avx512vl(auVar74,_DAT_01feed00,ZEXT1632(auVar53));
      auVar73 = vaddps_avx512vl(auVar82,auVar84);
      auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,ZEXT1632(auVar53));
      auVar85 = vsubps_avx(auVar67,auVar85);
      auVar84 = vsubps_avx512vl(auVar71,auVar84);
      auVar135 = ZEXT1632(auVar40);
      auVar80 = vsubps_avx512vl(auVar83,auVar135);
      auVar164 = ZEXT1632(auVar41);
      auVar72 = vsubps_avx512vl(auVar82,auVar164);
      auVar74 = vsubps_avx512vl(auVar67,auVar66);
      auVar80 = vaddps_avx512vl(auVar80,auVar74);
      auVar74 = vsubps_avx512vl(auVar71,auVar68);
      auVar72 = vaddps_avx512vl(auVar72,auVar74);
      auVar74 = vmulps_avx512vl(auVar164,auVar80);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar135,auVar72);
      auVar75 = vmulps_avx512vl(auVar70,auVar80);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar123,auVar72);
      auVar76 = vmulps_avx512vl(auVar69,auVar80);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar81,auVar72);
      auVar77 = vmulps_avx512vl(auVar68,auVar80);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar66,auVar72);
      auVar78 = vmulps_avx512vl(auVar82,auVar80);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar83,auVar72);
      auVar79 = vmulps_avx512vl(auVar73,auVar80);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar215,auVar72);
      auVar86 = vmulps_avx512vl(auVar84,auVar80);
      auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar85,auVar72);
      auVar80 = vmulps_avx512vl(auVar71,auVar80);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar67,auVar72);
      auVar72 = vminps_avx512vl(auVar74,auVar75);
      auVar74 = vmaxps_avx512vl(auVar74,auVar75);
      auVar75 = vminps_avx512vl(auVar76,auVar77);
      auVar72 = vminps_avx512vl(auVar72,auVar75);
      auVar75 = vmaxps_avx512vl(auVar76,auVar77);
      auVar74 = vmaxps_avx512vl(auVar74,auVar75);
      auVar75 = vminps_avx512vl(auVar78,auVar79);
      auVar76 = vmaxps_avx512vl(auVar78,auVar79);
      auVar77 = vminps_avx512vl(auVar86,auVar80);
      auVar75 = vminps_avx512vl(auVar75,auVar77);
      auVar72 = vminps_avx512vl(auVar72,auVar75);
      auVar80 = vmaxps_avx512vl(auVar86,auVar80);
      auVar80 = vmaxps_avx512vl(auVar76,auVar80);
      auVar80 = vmaxps_avx512vl(auVar74,auVar80);
      uVar13 = vcmpps_avx512vl(auVar72,local_148,2);
      auVar75._4_4_ = uStack_74;
      auVar75._0_4_ = local_78;
      auVar75._8_4_ = uStack_70;
      auVar75._12_4_ = uStack_6c;
      auVar75._16_4_ = uStack_68;
      auVar75._20_4_ = uStack_64;
      auVar75._24_4_ = uStack_60;
      auVar75._28_4_ = uStack_5c;
      uVar14 = vcmpps_avx512vl(auVar80,auVar75,5);
      bVar21 = (byte)uVar13 & (byte)uVar14 & 0x7f;
      if (bVar21 == 0) {
        auVar37 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar85._16_16_ = DAT_01feed20._16_16_;
      }
      else {
        auVar80 = vsubps_avx512vl(auVar66,auVar135);
        auVar72 = vsubps_avx512vl(auVar68,auVar164);
        auVar74 = vsubps_avx512vl(auVar67,auVar83);
        auVar80 = vaddps_avx512vl(auVar80,auVar74);
        auVar74 = vsubps_avx512vl(auVar71,auVar82);
        auVar72 = vaddps_avx512vl(auVar72,auVar74);
        auVar74 = vmulps_avx512vl(auVar164,auVar80);
        auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar72,auVar135);
        auVar70 = vmulps_avx512vl(auVar70,auVar80);
        auVar70 = vfnmadd213ps_avx512vl(auVar123,auVar72,auVar70);
        auVar69 = vmulps_avx512vl(auVar69,auVar80);
        auVar69 = vfnmadd213ps_avx512vl(auVar81,auVar72,auVar69);
        auVar81 = vmulps_avx512vl(auVar68,auVar80);
        auVar68 = vfnmadd231ps_avx512vl(auVar81,auVar72,auVar66);
        auVar81 = vmulps_avx512vl(auVar82,auVar80);
        auVar82 = vfnmadd231ps_avx512vl(auVar81,auVar72,auVar83);
        auVar81 = vmulps_avx512vl(auVar73,auVar80);
        auVar73 = vfnmadd213ps_avx512vl(auVar215,auVar72,auVar81);
        auVar81 = vmulps_avx512vl(auVar84,auVar80);
        auVar83 = vfnmadd213ps_avx512vl(auVar85,auVar72,auVar81);
        auVar85 = vmulps_avx512vl(auVar71,auVar80);
        auVar71 = vfnmadd231ps_avx512vl(auVar85,auVar67,auVar72);
        auVar81 = vminps_avx(auVar74,auVar70);
        auVar85 = vmaxps_avx(auVar74,auVar70);
        auVar66 = vminps_avx(auVar69,auVar68);
        auVar66 = vminps_avx(auVar81,auVar66);
        auVar81 = vmaxps_avx(auVar69,auVar68);
        auVar85 = vmaxps_avx(auVar85,auVar81);
        auVar84 = vminps_avx(auVar82,auVar73);
        auVar81 = vmaxps_avx(auVar82,auVar73);
        auVar67 = vminps_avx(auVar83,auVar71);
        auVar84 = vminps_avx(auVar84,auVar67);
        auVar84 = vminps_avx(auVar66,auVar84);
        auVar66 = vmaxps_avx(auVar83,auVar71);
        auVar81 = vmaxps_avx(auVar81,auVar66);
        auVar85 = vmaxps_avx(auVar85,auVar81);
        uVar13 = vcmpps_avx512vl(auVar85,auVar75,5);
        uVar14 = vcmpps_avx512vl(auVar84,local_148,2);
        bVar21 = bVar21 & (byte)uVar13 & (byte)uVar14;
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        if (bVar21 != 0) {
          auStack_338[uVar23] = (uint)bVar21;
          uVar13 = vmovlps_avx(auVar37);
          (&uStack_128)[uVar23] = uVar13;
          uVar36 = vmovlps_avx(auVar115);
          auStack_58[uVar23] = uVar36;
          uVar23 = (ulong)((int)uVar23 + 1);
        }
        auVar37 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar85._16_16_ = auVar81._16_16_;
      }
      auVar270 = ZEXT1664(auVar50);
      in_ZMM24 = ZEXT3264(_DAT_01feed20);
      auVar266 = ZEXT1664(auVar51);
      auVar265 = ZEXT3264(auVar81);
      auVar264 = ZEXT1664(auVar37);
      if ((int)uVar23 != 0) {
        do {
          auVar50 = auVar264._0_16_;
          uVar22 = (int)uVar23 - 1;
          uVar24 = (ulong)uVar22;
          uVar6 = auStack_338[uVar24];
          auVar115._8_8_ = 0;
          auVar115._0_8_ = auStack_58[uVar24];
          uVar36 = 0;
          for (uVar28 = (ulong)uVar6; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
          {
            uVar36 = uVar36 + 1;
          }
          uVar26 = uVar6 - 1 & uVar6;
          bVar33 = uVar26 == 0;
          auStack_338[uVar24] = uVar26;
          if (bVar33) {
            uVar23 = (ulong)uVar22;
          }
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar36;
          auVar37 = vpunpcklqdq_avx(auVar104,ZEXT416((int)uVar36 + 1));
          auVar37 = vcvtqq2ps_avx512vl(auVar37);
          auVar37 = vmulps_avx512vl(auVar37,auVar266._0_16_);
          uVar100 = *(undefined4 *)((long)&uStack_128 + uVar24 * 8 + 4);
          auVar15._4_4_ = uVar100;
          auVar15._0_4_ = uVar100;
          auVar15._8_4_ = uVar100;
          auVar15._12_4_ = uVar100;
          auVar51 = vmulps_avx512vl(auVar37,auVar15);
          auVar53 = auVar268._0_16_;
          auVar37 = vsubps_avx512vl(auVar53,auVar37);
          uVar100 = *(undefined4 *)(&uStack_128 + uVar24);
          auVar16._4_4_ = uVar100;
          auVar16._0_4_ = uVar100;
          auVar16._8_4_ = uVar100;
          auVar16._12_4_ = uVar100;
          auVar37 = vfmadd231ps_avx512vl(auVar51,auVar37,auVar16);
          auVar51 = vmovshdup_avx(auVar37);
          fVar231 = auVar51._0_4_ - auVar37._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar231));
          if (uVar6 == 0 || bVar33) goto LAB_01bc6f9d;
          auVar51 = vshufps_avx(auVar115,auVar115,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar231));
          uVar22 = (uint)uVar23;
          auVar40 = vsubps_avx512vl(auVar53,auVar51);
          fVar216 = auVar51._0_4_;
          auVar159._0_4_ = fVar216 * fVar138;
          fVar226 = auVar51._4_4_;
          auVar159._4_4_ = fVar226 * fVar143;
          fVar227 = auVar51._8_4_;
          auVar159._8_4_ = fVar227 * fVar138;
          fVar228 = auVar51._12_4_;
          auVar159._12_4_ = fVar228 * fVar143;
          auVar175._0_4_ = fVar216 * fVar210;
          auVar175._4_4_ = fVar226 * fVar124;
          auVar175._8_4_ = fVar227 * fVar210;
          auVar175._12_4_ = fVar228 * fVar124;
          auVar182._0_4_ = fVar216 * fVar136;
          auVar182._4_4_ = fVar226 * fVar137;
          auVar182._8_4_ = fVar227 * fVar136;
          auVar182._12_4_ = fVar228 * fVar137;
          auVar131._0_4_ = fVar216 * fVar232;
          auVar131._4_4_ = fVar226 * fVar242;
          auVar131._8_4_ = fVar227 * fVar232;
          auVar131._12_4_ = fVar228 * fVar242;
          auVar51 = vfmadd231ps_fma(auVar159,auVar40,auVar38);
          auVar54 = vfmadd231ps_fma(auVar175,auVar40,auVar49);
          auVar55 = vfmadd231ps_fma(auVar182,auVar40,auVar189);
          auVar40 = vfmadd231ps_fma(auVar131,auVar40,auVar200);
          auVar79._16_16_ = auVar51;
          auVar79._0_16_ = auVar51;
          auVar165._16_16_ = auVar54;
          auVar165._0_16_ = auVar54;
          auVar179._16_16_ = auVar55;
          auVar179._0_16_ = auVar55;
          auVar81 = vpermps_avx512vl(in_ZMM24._0_32_,ZEXT1632(auVar37));
          auVar85 = vsubps_avx(auVar165,auVar79);
          auVar54 = vfmadd213ps_fma(auVar85,auVar81,auVar79);
          auVar85 = vsubps_avx(auVar179,auVar165);
          auVar41 = vfmadd213ps_fma(auVar85,auVar81,auVar165);
          auVar51 = vsubps_avx(auVar40,auVar55);
          auVar166._16_16_ = auVar51;
          auVar166._0_16_ = auVar51;
          auVar51 = vfmadd213ps_fma(auVar166,auVar81,auVar179);
          auVar85 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar54));
          auVar54 = vfmadd213ps_fma(auVar85,auVar81,ZEXT1632(auVar54));
          auVar85 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar41));
          auVar51 = vfmadd213ps_fma(auVar85,auVar81,ZEXT1632(auVar41));
          auVar85 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar54));
          auVar65 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar85,auVar81);
          auVar85 = vmulps_avx512vl(auVar85,auVar265._0_32_);
          auVar51 = vmulss_avx512f(ZEXT416((uint)fVar231),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar216 = auVar51._0_4_;
          auVar183._0_8_ =
               CONCAT44(auVar65._4_4_ + fVar216 * auVar85._4_4_,
                        auVar65._0_4_ + fVar216 * auVar85._0_4_);
          auVar183._8_4_ = auVar65._8_4_ + fVar216 * auVar85._8_4_;
          auVar183._12_4_ = auVar65._12_4_ + fVar216 * auVar85._12_4_;
          auVar160._0_4_ = fVar216 * auVar85._16_4_;
          auVar160._4_4_ = fVar216 * auVar85._20_4_;
          auVar160._8_4_ = fVar216 * auVar85._24_4_;
          auVar160._12_4_ = fVar216 * auVar85._28_4_;
          auVar45 = vsubps_avx((undefined1  [16])0x0,auVar160);
          auVar41 = vshufpd_avx(auVar65,auVar65,3);
          auVar42 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar51 = vsubps_avx(auVar41,auVar65);
          auVar54 = vsubps_avx(auVar42,(undefined1  [16])0x0);
          auVar201._0_4_ = auVar51._0_4_ + auVar54._0_4_;
          auVar201._4_4_ = auVar51._4_4_ + auVar54._4_4_;
          auVar201._8_4_ = auVar51._8_4_ + auVar54._8_4_;
          auVar201._12_4_ = auVar51._12_4_ + auVar54._12_4_;
          auVar51 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar54 = vshufps_avx(auVar183,auVar183,0xb1);
          auVar55 = vshufps_avx(auVar45,auVar45,0xb1);
          auVar40 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar253._4_4_ = auVar201._0_4_;
          auVar253._0_4_ = auVar201._0_4_;
          auVar253._8_4_ = auVar201._0_4_;
          auVar253._12_4_ = auVar201._0_4_;
          auVar43 = vshufps_avx(auVar201,auVar201,0x55);
          fVar216 = auVar43._0_4_;
          auVar212._0_4_ = auVar51._0_4_ * fVar216;
          fVar226 = auVar43._4_4_;
          auVar212._4_4_ = auVar51._4_4_ * fVar226;
          fVar227 = auVar43._8_4_;
          auVar212._8_4_ = auVar51._8_4_ * fVar227;
          fVar228 = auVar43._12_4_;
          auVar212._12_4_ = auVar51._12_4_ * fVar228;
          auVar218._0_4_ = auVar54._0_4_ * fVar216;
          auVar218._4_4_ = auVar54._4_4_ * fVar226;
          auVar218._8_4_ = auVar54._8_4_ * fVar227;
          auVar218._12_4_ = auVar54._12_4_ * fVar228;
          auVar235._0_4_ = auVar55._0_4_ * fVar216;
          auVar235._4_4_ = auVar55._4_4_ * fVar226;
          auVar235._8_4_ = auVar55._8_4_ * fVar227;
          auVar235._12_4_ = auVar55._12_4_ * fVar228;
          auVar202._0_4_ = auVar40._0_4_ * fVar216;
          auVar202._4_4_ = auVar40._4_4_ * fVar226;
          auVar202._8_4_ = auVar40._8_4_ * fVar227;
          auVar202._12_4_ = auVar40._12_4_ * fVar228;
          auVar51 = vfmadd231ps_fma(auVar212,auVar253,auVar65);
          auVar54 = vfmadd231ps_fma(auVar218,auVar253,auVar183);
          auVar47 = vfmadd231ps_fma(auVar235,auVar253,auVar45);
          auVar48 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar253);
          auVar43 = vshufpd_avx(auVar51,auVar51,1);
          auVar44 = vshufpd_avx(auVar54,auVar54,1);
          auVar60 = vshufpd_avx512vl(auVar47,auVar47,1);
          auVar61 = vshufpd_avx512vl(auVar48,auVar48,1);
          auVar55 = vminss_avx(auVar51,auVar54);
          auVar51 = vmaxss_avx(auVar54,auVar51);
          auVar40 = vminss_avx(auVar47,auVar48);
          auVar54 = vmaxss_avx(auVar48,auVar47);
          auVar55 = vminss_avx(auVar55,auVar40);
          auVar51 = vmaxss_avx(auVar54,auVar51);
          auVar40 = vminss_avx(auVar43,auVar44);
          auVar54 = vmaxss_avx(auVar44,auVar43);
          auVar43 = vminss_avx512f(auVar60,auVar61);
          auVar44 = vmaxss_avx512f(auVar61,auVar60);
          auVar54 = vmaxss_avx(auVar44,auVar54);
          auVar40 = vminss_avx512f(auVar40,auVar43);
          vucomiss_avx512f(auVar55);
          fVar226 = auVar54._0_4_;
          fVar216 = auVar51._0_4_;
          if (uVar22 < 5) {
LAB_01bc7729:
            auVar43 = vucomiss_avx512f(auVar40);
            bVar34 = fVar226 <= -0.0001;
            bVar32 = -0.0001 < fVar216;
            bVar31 = bVar34;
            if (!bVar34) goto LAB_01bc776f;
            uVar13 = vcmpps_avx512vl(auVar55,auVar43,5);
            uVar14 = vcmpps_avx512vl(auVar40,auVar43,5);
            bVar21 = (byte)uVar13 & (byte)uVar14 & 1;
            bVar34 = bVar32 && bVar21 == 0;
            bVar31 = bVar32 && bVar21 == 0;
            if (bVar32 && bVar21 == 0) goto LAB_01bc776f;
          }
          else {
            bVar34 = fVar226 == -0.0001;
            bVar31 = NAN(fVar226);
            if (fVar226 <= -0.0001) goto LAB_01bc7729;
LAB_01bc776f:
            vcmpss_avx512f(auVar55,auVar50,1);
            auVar47 = auVar269._0_16_;
            uVar13 = vcmpss_avx512f(auVar51,auVar50,1);
            bVar32 = (bool)((byte)uVar13 & 1);
            auVar85._0_16_ = auVar47;
            iVar98 = auVar269._0_4_;
            auVar87._4_28_ = auVar85._4_28_;
            auVar87._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar98);
            vucomiss_avx512f(auVar87._0_16_);
            bVar31 = (bool)(!bVar34 | bVar31);
            bVar32 = bVar31 == false;
            auVar89._16_16_ = auVar85._16_16_;
            auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (uint)bVar31 * auVar264._0_4_ + (uint)!bVar31 * 0x7f800000;
            auVar44 = auVar88._0_16_;
            auVar91._16_16_ = auVar85._16_16_;
            auVar91._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar90._4_28_ = auVar91._4_28_;
            auVar90._0_4_ = (uint)bVar31 * auVar264._0_4_ + (uint)!bVar31 * -0x800000;
            auVar43 = auVar90._0_16_;
            uVar13 = vcmpss_avx512f(auVar40,auVar50,1);
            bVar34 = (bool)((byte)uVar13 & 1);
            auVar93._16_16_ = auVar85._16_16_;
            auVar93._0_16_ = auVar47;
            auVar92._4_28_ = auVar93._4_28_;
            auVar92._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar98);
            vucomiss_avx512f(auVar92._0_16_);
            if ((bVar31) || (bVar32)) {
              auVar40 = vucomiss_avx512f(auVar55);
              if ((bVar31) || (bVar32)) {
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar48 = vxorps_avx512vl(auVar55,auVar20);
                auVar55 = vsubss_avx512f(auVar40,auVar55);
                auVar55 = vdivss_avx512f(auVar48,auVar55);
                auVar40 = vsubss_avx512f(auVar47,auVar55);
                auVar55 = vfmadd213ss_avx512f(auVar40,auVar50,auVar55);
                auVar40 = auVar55;
              }
              else {
                auVar40 = vxorps_avx512vl(auVar40,auVar40);
                vucomiss_avx512f(auVar40);
                if ((bVar31) || (auVar55 = auVar47, bVar32)) {
                  auVar55 = SUB6416(ZEXT464(0xff800000),0);
                  auVar40 = ZEXT416(0x7f800000);
                }
              }
              auVar44 = vminss_avx512f(auVar44,auVar40);
              auVar43 = vmaxss_avx(auVar55,auVar43);
            }
            uVar13 = vcmpss_avx512f(auVar54,auVar50,1);
            bVar34 = (bool)((byte)uVar13 & 1);
            fVar227 = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar98);
            if ((auVar87._0_4_ != fVar227) || (NAN(auVar87._0_4_) || NAN(fVar227))) {
              if ((fVar226 != fVar216) || (NAN(fVar226) || NAN(fVar216))) {
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar51 = vxorps_avx512vl(auVar51,auVar19);
                auVar203._0_4_ = auVar51._0_4_ / (fVar226 - fVar216);
                auVar203._4_12_ = auVar51._4_12_;
                auVar51 = vsubss_avx512f(auVar47,auVar203);
                auVar51 = vfmadd213ss_avx512f(auVar51,auVar50,auVar203);
                auVar54 = auVar51;
              }
              else if ((fVar216 != 0.0) ||
                      (auVar51 = auVar47, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar216))) {
                auVar51 = SUB6416(ZEXT464(0xff800000),0);
                auVar54 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar44 = vminss_avx(auVar44,auVar54);
              auVar43 = vmaxss_avx(auVar51,auVar43);
            }
            bVar34 = auVar92._0_4_ != fVar227;
            auVar51 = vminss_avx512f(auVar44,auVar47);
            auVar95._16_16_ = auVar85._16_16_;
            auVar95._0_16_ = auVar44;
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar34 * auVar51._0_4_ + (uint)!bVar34 * auVar44._0_4_;
            auVar51 = vmaxss_avx512f(auVar47,auVar43);
            auVar97._16_16_ = auVar85._16_16_;
            auVar97._0_16_ = auVar43;
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar34 * auVar51._0_4_ + (uint)!bVar34 * auVar43._0_4_;
            auVar51 = vmaxss_avx512f(auVar50,auVar94._0_16_);
            auVar54 = vminss_avx512f(auVar96._0_16_,auVar47);
            if (auVar51._0_4_ <= auVar54._0_4_) {
              auVar40 = vmaxss_avx512f(auVar50,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
              auVar48 = vminss_avx512f(ZEXT416((uint)(auVar54._0_4_ + 0.1)),auVar47);
              auVar132._0_8_ = auVar65._0_8_;
              auVar132._8_8_ = auVar132._0_8_;
              auVar219._8_8_ = auVar183._0_8_;
              auVar219._0_8_ = auVar183._0_8_;
              auVar236._8_8_ = auVar45._0_8_;
              auVar236._0_8_ = auVar45._0_8_;
              auVar51 = vshufpd_avx(auVar183,auVar183,3);
              auVar54 = vshufpd_avx(auVar45,auVar45,3);
              auVar55 = vshufps_avx(auVar40,auVar48,0);
              auVar44 = vsubps_avx512vl(auVar53,auVar55);
              fVar216 = auVar55._0_4_;
              auVar176._0_4_ = fVar216 * auVar41._0_4_;
              fVar226 = auVar55._4_4_;
              auVar176._4_4_ = fVar226 * auVar41._4_4_;
              fVar227 = auVar55._8_4_;
              auVar176._8_4_ = fVar227 * auVar41._8_4_;
              fVar228 = auVar55._12_4_;
              auVar176._12_4_ = fVar228 * auVar41._12_4_;
              auVar184._0_4_ = fVar216 * auVar51._0_4_;
              auVar184._4_4_ = fVar226 * auVar51._4_4_;
              auVar184._8_4_ = fVar227 * auVar51._8_4_;
              auVar184._12_4_ = fVar228 * auVar51._12_4_;
              auVar259._0_4_ = auVar54._0_4_ * fVar216;
              auVar259._4_4_ = auVar54._4_4_ * fVar226;
              auVar259._8_4_ = auVar54._8_4_ * fVar227;
              auVar259._12_4_ = auVar54._12_4_ * fVar228;
              auVar161._0_4_ = fVar216 * auVar42._0_4_;
              auVar161._4_4_ = fVar226 * auVar42._4_4_;
              auVar161._8_4_ = fVar227 * auVar42._8_4_;
              auVar161._12_4_ = fVar228 * auVar42._12_4_;
              auVar41 = vfmadd231ps_fma(auVar176,auVar44,auVar132);
              auVar42 = vfmadd231ps_fma(auVar184,auVar44,auVar219);
              auVar43 = vfmadd231ps_fma(auVar259,auVar44,auVar236);
              auVar44 = vfmadd231ps_fma(auVar161,auVar44,ZEXT816(0));
              auVar54 = vsubss_avx512f(auVar47,auVar40);
              auVar51 = vmovshdup_avx(auVar115);
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar40._0_4_)),auVar115,
                                        auVar54);
              auVar54 = vsubss_avx512f(auVar47,auVar48);
              auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar48._0_4_)),auVar115,
                                        auVar54);
              auVar45 = vdivss_avx512f(auVar47,ZEXT416((uint)fVar231));
              auVar51 = vsubps_avx(auVar42,auVar41);
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar55 = vmulps_avx512vl(auVar51,auVar48);
              auVar51 = vsubps_avx(auVar43,auVar42);
              auVar40 = vmulps_avx512vl(auVar51,auVar48);
              auVar51 = vsubps_avx(auVar44,auVar43);
              auVar51 = vmulps_avx512vl(auVar51,auVar48);
              auVar54 = vminps_avx(auVar40,auVar51);
              auVar51 = vmaxps_avx(auVar40,auVar51);
              auVar54 = vminps_avx(auVar55,auVar54);
              auVar51 = vmaxps_avx(auVar55,auVar51);
              auVar55 = vshufpd_avx(auVar54,auVar54,3);
              auVar40 = vshufpd_avx(auVar51,auVar51,3);
              auVar54 = vminps_avx(auVar54,auVar55);
              auVar51 = vmaxps_avx(auVar51,auVar40);
              fVar231 = auVar45._0_4_;
              auVar204._0_4_ = auVar54._0_4_ * fVar231;
              auVar204._4_4_ = auVar54._4_4_ * fVar231;
              auVar204._8_4_ = auVar54._8_4_ * fVar231;
              auVar204._12_4_ = auVar54._12_4_ * fVar231;
              auVar190._0_4_ = fVar231 * auVar51._0_4_;
              auVar190._4_4_ = fVar231 * auVar51._4_4_;
              auVar190._8_4_ = fVar231 * auVar51._8_4_;
              auVar190._12_4_ = fVar231 * auVar51._12_4_;
              auVar45 = vdivss_avx512f(auVar47,ZEXT416((uint)(auVar61._0_4_ - auVar60._0_4_)));
              auVar51 = vshufpd_avx(auVar41,auVar41,3);
              auVar54 = vshufpd_avx(auVar42,auVar42,3);
              auVar55 = vshufpd_avx(auVar43,auVar43,3);
              auVar40 = vshufpd_avx(auVar44,auVar44,3);
              auVar51 = vsubps_avx(auVar51,auVar41);
              auVar41 = vsubps_avx(auVar54,auVar42);
              auVar42 = vsubps_avx(auVar55,auVar43);
              auVar40 = vsubps_avx(auVar40,auVar44);
              auVar54 = vminps_avx(auVar51,auVar41);
              auVar51 = vmaxps_avx(auVar51,auVar41);
              auVar55 = vminps_avx(auVar42,auVar40);
              auVar55 = vminps_avx(auVar54,auVar55);
              auVar54 = vmaxps_avx(auVar42,auVar40);
              auVar51 = vmaxps_avx(auVar51,auVar54);
              fVar231 = auVar45._0_4_;
              auVar237._0_4_ = fVar231 * auVar55._0_4_;
              auVar237._4_4_ = fVar231 * auVar55._4_4_;
              auVar237._8_4_ = fVar231 * auVar55._8_4_;
              auVar237._12_4_ = fVar231 * auVar55._12_4_;
              auVar220._0_4_ = fVar231 * auVar51._0_4_;
              auVar220._4_4_ = fVar231 * auVar51._4_4_;
              auVar220._8_4_ = fVar231 * auVar51._8_4_;
              auVar220._12_4_ = fVar231 * auVar51._12_4_;
              auVar40 = vinsertps_avx(auVar37,auVar60,0x10);
              auVar62 = vpermt2ps_avx512vl(auVar37,_DAT_01feecd0,auVar61);
              auVar116._0_4_ = auVar40._0_4_ + auVar62._0_4_;
              auVar116._4_4_ = auVar40._4_4_ + auVar62._4_4_;
              auVar116._8_4_ = auVar40._8_4_ + auVar62._8_4_;
              auVar116._12_4_ = auVar40._12_4_ + auVar62._12_4_;
              auVar45 = vmulps_avx512vl(auVar116,auVar270._0_16_);
              auVar54 = vshufps_avx(auVar45,auVar45,0x54);
              uVar100 = auVar45._0_4_;
              auVar119._4_4_ = uVar100;
              auVar119._0_4_ = uVar100;
              auVar119._8_4_ = uVar100;
              auVar119._12_4_ = uVar100;
              auVar42 = vfmadd213ps_avx512vl(local_158,auVar119,auVar39);
              auVar55 = vfmadd213ps_fma(local_168,auVar119,auVar46);
              auVar41 = vfmadd213ps_fma(local_178,auVar119,auVar52);
              auVar51 = vsubps_avx(auVar55,auVar42);
              auVar42 = vfmadd213ps_fma(auVar51,auVar119,auVar42);
              auVar51 = vsubps_avx(auVar41,auVar55);
              auVar51 = vfmadd213ps_fma(auVar51,auVar119,auVar55);
              auVar51 = vsubps_avx(auVar51,auVar42);
              auVar55 = vfmadd231ps_fma(auVar42,auVar51,auVar119);
              auVar43 = vmulps_avx512vl(auVar51,auVar48);
              auVar246._8_8_ = auVar55._0_8_;
              auVar246._0_8_ = auVar55._0_8_;
              auVar51 = vshufpd_avx(auVar55,auVar55,3);
              auVar55 = vshufps_avx(auVar45,auVar45,0x55);
              auVar41 = vsubps_avx(auVar51,auVar246);
              auVar42 = vfmadd231ps_fma(auVar246,auVar55,auVar41);
              auVar260._8_8_ = auVar43._0_8_;
              auVar260._0_8_ = auVar43._0_8_;
              auVar51 = vshufpd_avx(auVar43,auVar43,3);
              auVar51 = vsubps_avx512vl(auVar51,auVar260);
              auVar51 = vfmadd213ps_avx512vl(auVar51,auVar55,auVar260);
              auVar120._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
              auVar120._8_4_ = auVar41._8_4_ ^ 0x80000000;
              auVar120._12_4_ = auVar41._12_4_ ^ 0x80000000;
              auVar55 = vmovshdup_avx512vl(auVar51);
              auVar261._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
              auVar261._8_4_ = auVar55._8_4_ ^ 0x80000000;
              auVar261._12_4_ = auVar55._12_4_ ^ 0x80000000;
              auVar43 = vmovshdup_avx512vl(auVar41);
              auVar44 = vpermt2ps_avx512vl(auVar261,ZEXT416(5),auVar41);
              auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar41._0_4_)),auVar51,
                                            auVar43);
              auVar41 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar120);
              auVar162._0_4_ = auVar55._0_4_;
              auVar162._4_4_ = auVar162._0_4_;
              auVar162._8_4_ = auVar162._0_4_;
              auVar162._12_4_ = auVar162._0_4_;
              auVar51 = vdivps_avx(auVar44,auVar162);
              auVar63 = vdivps_avx512vl(auVar41,auVar162);
              fVar231 = auVar42._0_4_;
              auVar55 = vshufps_avx(auVar42,auVar42,0x55);
              auVar247._0_4_ = fVar231 * auVar51._0_4_ + auVar55._0_4_ * auVar63._0_4_;
              auVar247._4_4_ = fVar231 * auVar51._4_4_ + auVar55._4_4_ * auVar63._4_4_;
              auVar247._8_4_ = fVar231 * auVar51._8_4_ + auVar55._8_4_ * auVar63._8_4_;
              auVar247._12_4_ = fVar231 * auVar51._12_4_ + auVar55._12_4_ * auVar63._12_4_;
              auVar48 = vsubps_avx(auVar54,auVar247);
              auVar55 = vmovshdup_avx(auVar51);
              auVar54 = vinsertps_avx(auVar204,auVar237,0x1c);
              auVar262._0_4_ = auVar55._0_4_ * auVar54._0_4_;
              auVar262._4_4_ = auVar55._4_4_ * auVar54._4_4_;
              auVar262._8_4_ = auVar55._8_4_ * auVar54._8_4_;
              auVar262._12_4_ = auVar55._12_4_ * auVar54._12_4_;
              auVar65 = vinsertps_avx512f(auVar190,auVar220,0x1c);
              auVar55 = vmulps_avx512vl(auVar55,auVar65);
              auVar44 = vminps_avx512vl(auVar262,auVar55);
              auVar42 = vmaxps_avx(auVar55,auVar262);
              auVar43 = vmovshdup_avx(auVar63);
              auVar55 = vinsertps_avx(auVar237,auVar204,0x4c);
              auVar238._0_4_ = auVar43._0_4_ * auVar55._0_4_;
              auVar238._4_4_ = auVar43._4_4_ * auVar55._4_4_;
              auVar238._8_4_ = auVar43._8_4_ * auVar55._8_4_;
              auVar238._12_4_ = auVar43._12_4_ * auVar55._12_4_;
              auVar41 = vinsertps_avx(auVar220,auVar190,0x4c);
              auVar221._0_4_ = auVar43._0_4_ * auVar41._0_4_;
              auVar221._4_4_ = auVar43._4_4_ * auVar41._4_4_;
              auVar221._8_4_ = auVar43._8_4_ * auVar41._8_4_;
              auVar221._12_4_ = auVar43._12_4_ * auVar41._12_4_;
              auVar43 = vminps_avx(auVar238,auVar221);
              auVar44 = vaddps_avx512vl(auVar44,auVar43);
              auVar43 = vmaxps_avx(auVar221,auVar238);
              auVar222._0_4_ = auVar42._0_4_ + auVar43._0_4_;
              auVar222._4_4_ = auVar42._4_4_ + auVar43._4_4_;
              auVar222._8_4_ = auVar42._8_4_ + auVar43._8_4_;
              auVar222._12_4_ = auVar42._12_4_ + auVar43._12_4_;
              auVar239._8_8_ = 0x3f80000000000000;
              auVar239._0_8_ = 0x3f80000000000000;
              auVar42 = vsubps_avx(auVar239,auVar222);
              auVar43 = vsubps_avx(auVar239,auVar44);
              auVar44 = vsubps_avx(auVar40,auVar45);
              auVar45 = vsubps_avx(auVar62,auVar45);
              fVar228 = auVar44._0_4_;
              auVar263._0_4_ = fVar228 * auVar42._0_4_;
              fVar229 = auVar44._4_4_;
              auVar263._4_4_ = fVar229 * auVar42._4_4_;
              fVar230 = auVar44._8_4_;
              auVar263._8_4_ = fVar230 * auVar42._8_4_;
              fVar144 = auVar44._12_4_;
              auVar263._12_4_ = fVar144 * auVar42._12_4_;
              auVar64 = vbroadcastss_avx512vl(auVar51);
              auVar54 = vmulps_avx512vl(auVar64,auVar54);
              auVar65 = vmulps_avx512vl(auVar64,auVar65);
              auVar64 = vminps_avx512vl(auVar54,auVar65);
              auVar65 = vmaxps_avx512vl(auVar65,auVar54);
              auVar54 = vbroadcastss_avx512vl(auVar63);
              auVar55 = vmulps_avx512vl(auVar54,auVar55);
              auVar54 = vmulps_avx512vl(auVar54,auVar41);
              auVar41 = vminps_avx512vl(auVar55,auVar54);
              auVar41 = vaddps_avx512vl(auVar64,auVar41);
              auVar44 = vmulps_avx512vl(auVar44,auVar43);
              fVar231 = auVar45._0_4_;
              auVar223._0_4_ = fVar231 * auVar42._0_4_;
              fVar216 = auVar45._4_4_;
              auVar223._4_4_ = fVar216 * auVar42._4_4_;
              fVar226 = auVar45._8_4_;
              auVar223._8_4_ = fVar226 * auVar42._8_4_;
              fVar227 = auVar45._12_4_;
              auVar223._12_4_ = fVar227 * auVar42._12_4_;
              auVar240._0_4_ = fVar231 * auVar43._0_4_;
              auVar240._4_4_ = fVar216 * auVar43._4_4_;
              auVar240._8_4_ = fVar226 * auVar43._8_4_;
              auVar240._12_4_ = fVar227 * auVar43._12_4_;
              auVar54 = vmaxps_avx(auVar54,auVar55);
              auVar191._0_4_ = auVar65._0_4_ + auVar54._0_4_;
              auVar191._4_4_ = auVar65._4_4_ + auVar54._4_4_;
              auVar191._8_4_ = auVar65._8_4_ + auVar54._8_4_;
              auVar191._12_4_ = auVar65._12_4_ + auVar54._12_4_;
              auVar205._8_8_ = 0x3f800000;
              auVar205._0_8_ = 0x3f800000;
              auVar54 = vsubps_avx(auVar205,auVar191);
              auVar55 = vsubps_avx512vl(auVar205,auVar41);
              auVar254._0_4_ = fVar228 * auVar54._0_4_;
              auVar254._4_4_ = fVar229 * auVar54._4_4_;
              auVar254._8_4_ = fVar230 * auVar54._8_4_;
              auVar254._12_4_ = fVar144 * auVar54._12_4_;
              auVar248._0_4_ = fVar228 * auVar55._0_4_;
              auVar248._4_4_ = fVar229 * auVar55._4_4_;
              auVar248._8_4_ = fVar230 * auVar55._8_4_;
              auVar248._12_4_ = fVar144 * auVar55._12_4_;
              auVar192._0_4_ = fVar231 * auVar54._0_4_;
              auVar192._4_4_ = fVar216 * auVar54._4_4_;
              auVar192._8_4_ = fVar226 * auVar54._8_4_;
              auVar192._12_4_ = fVar227 * auVar54._12_4_;
              auVar206._0_4_ = fVar231 * auVar55._0_4_;
              auVar206._4_4_ = fVar216 * auVar55._4_4_;
              auVar206._8_4_ = fVar226 * auVar55._8_4_;
              auVar206._12_4_ = fVar227 * auVar55._12_4_;
              auVar54 = vminps_avx(auVar254,auVar248);
              auVar55 = vminps_avx512vl(auVar192,auVar206);
              auVar41 = vminps_avx512vl(auVar54,auVar55);
              auVar54 = vmaxps_avx(auVar248,auVar254);
              auVar55 = vmaxps_avx(auVar206,auVar192);
              auVar55 = vmaxps_avx(auVar55,auVar54);
              auVar42 = vminps_avx512vl(auVar263,auVar44);
              auVar54 = vminps_avx(auVar223,auVar240);
              auVar54 = vminps_avx(auVar42,auVar54);
              auVar54 = vhaddps_avx(auVar41,auVar54);
              auVar42 = vmaxps_avx512vl(auVar44,auVar263);
              auVar41 = vmaxps_avx(auVar240,auVar223);
              auVar41 = vmaxps_avx(auVar41,auVar42);
              auVar55 = vhaddps_avx(auVar55,auVar41);
              auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
              auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
              auVar193._0_4_ = auVar54._0_4_ + auVar48._0_4_;
              auVar193._4_4_ = auVar54._4_4_ + auVar48._4_4_;
              auVar193._8_4_ = auVar54._8_4_ + auVar48._8_4_;
              auVar193._12_4_ = auVar54._12_4_ + auVar48._12_4_;
              auVar207._0_4_ = auVar55._0_4_ + auVar48._0_4_;
              auVar207._4_4_ = auVar55._4_4_ + auVar48._4_4_;
              auVar207._8_4_ = auVar55._8_4_ + auVar48._8_4_;
              auVar207._12_4_ = auVar55._12_4_ + auVar48._12_4_;
              auVar54 = vmaxps_avx(auVar40,auVar193);
              auVar55 = vminps_avx(auVar207,auVar62);
              uVar36 = vcmpps_avx512vl(auVar55,auVar54,1);
              if ((uVar36 & 3) == 0) {
                uVar36 = vcmpps_avx512vl(auVar207,auVar62,1);
                uVar13 = vcmpps_avx512vl(auVar37,auVar193,1);
                if (((ushort)uVar13 & (ushort)uVar36 & 1) == 0) {
                  bVar21 = 0;
                }
                else {
                  auVar54 = vmovshdup_avx(auVar193);
                  bVar21 = auVar60._0_4_ < auVar54._0_4_ & (byte)(uVar36 >> 1) & 0x7f;
                }
                if (((3 < uVar22 || uVar6 != 0 && !bVar33) | bVar21) != 1) {
                  auVar115 = vinsertps_avx(auVar60,auVar61,0x10);
                  goto LAB_01bc6f9d;
                }
                lVar25 = 200;
                do {
                  auVar37 = vsubss_avx512f(auVar47,auVar48);
                  fVar226 = auVar37._0_4_;
                  fVar231 = fVar226 * fVar226 * fVar226;
                  fVar227 = auVar48._0_4_;
                  fVar216 = fVar227 * 3.0 * fVar226 * fVar226;
                  fVar226 = fVar226 * fVar227 * fVar227 * 3.0;
                  auVar142._4_4_ = fVar231;
                  auVar142._0_4_ = fVar231;
                  auVar142._8_4_ = fVar231;
                  auVar142._12_4_ = fVar231;
                  auVar133._4_4_ = fVar216;
                  auVar133._0_4_ = fVar216;
                  auVar133._8_4_ = fVar216;
                  auVar133._12_4_ = fVar216;
                  auVar105._4_4_ = fVar226;
                  auVar105._0_4_ = fVar226;
                  auVar105._8_4_ = fVar226;
                  auVar105._12_4_ = fVar226;
                  fVar227 = fVar227 * fVar227 * fVar227;
                  auVar177._0_4_ = (float)local_348._0_4_ * fVar227;
                  auVar177._4_4_ = (float)local_348._4_4_ * fVar227;
                  auVar177._8_4_ = fStack_340 * fVar227;
                  auVar177._12_4_ = fStack_33c * fVar227;
                  auVar37 = vfmadd231ps_fma(auVar177,auVar52,auVar105);
                  auVar37 = vfmadd231ps_fma(auVar37,auVar46,auVar133);
                  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar39,auVar142);
                  auVar106._8_8_ = auVar37._0_8_;
                  auVar106._0_8_ = auVar37._0_8_;
                  auVar37 = vshufpd_avx(auVar37,auVar37,3);
                  auVar54 = vshufps_avx(auVar48,auVar48,0x55);
                  auVar37 = vsubps_avx(auVar37,auVar106);
                  auVar54 = vfmadd213ps_fma(auVar37,auVar54,auVar106);
                  fVar231 = auVar54._0_4_;
                  auVar37 = vshufps_avx(auVar54,auVar54,0x55);
                  auVar107._0_4_ = auVar51._0_4_ * fVar231 + auVar63._0_4_ * auVar37._0_4_;
                  auVar107._4_4_ = auVar51._4_4_ * fVar231 + auVar63._4_4_ * auVar37._4_4_;
                  auVar107._8_4_ = auVar51._8_4_ * fVar231 + auVar63._8_4_ * auVar37._8_4_;
                  auVar107._12_4_ = auVar51._12_4_ * fVar231 + auVar63._12_4_ * auVar37._12_4_;
                  auVar48 = vsubps_avx(auVar48,auVar107);
                  auVar37 = vandps_avx512vl(auVar54,auVar267._0_16_);
                  auVar54 = vprolq_avx512vl(auVar37,0x20);
                  auVar37 = vmaxss_avx(auVar54,auVar37);
                  bVar33 = auVar37._0_4_ <= (float)local_358._0_4_;
                  if (auVar37._0_4_ < (float)local_358._0_4_) {
                    auVar37 = vucomiss_avx512f(auVar50);
                    if (bVar33) {
                      auVar51 = vucomiss_avx512f(auVar37);
                      auVar269 = ZEXT1664(auVar51);
                      if (bVar33) {
                        vmovshdup_avx(auVar37);
                        auVar51 = vucomiss_avx512f(auVar50);
                        if (bVar33) {
                          auVar54 = vucomiss_avx512f(auVar51);
                          auVar269 = ZEXT1664(auVar54);
                          if (bVar33) {
                            auVar55 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar47 = vinsertps_avx(auVar55,ZEXT416((uint)pre->ray_space[k].vz.
                                                                          field_0.m128[2]),0x28);
                            auVar55 = vdpps_avx(auVar47,local_188,0x7f);
                            auVar40 = vdpps_avx(auVar47,local_198,0x7f);
                            auVar41 = vdpps_avx(auVar47,local_1a8,0x7f);
                            auVar42 = vdpps_avx(auVar47,local_1b8,0x7f);
                            auVar43 = vdpps_avx(auVar47,local_1c8,0x7f);
                            auVar44 = vdpps_avx(auVar47,local_1d8,0x7f);
                            auVar45 = vdpps_avx(auVar47,local_1e8,0x7f);
                            auVar47 = vdpps_avx(auVar47,local_1f8,0x7f);
                            auVar48 = vsubss_avx512f(auVar54,auVar51);
                            fVar231 = auVar51._0_4_;
                            auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar43._0_4_)),
                                                      auVar48,auVar55);
                            auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar231)),
                                                      auVar48,auVar40);
                            auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar231)),
                                                      auVar48,auVar41);
                            auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar47._0_4_)),
                                                      auVar48,auVar42);
                            auVar54 = vsubss_avx512f(auVar54,auVar37);
                            auVar185._0_4_ = auVar54._0_4_;
                            fVar231 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
                            local_d8 = auVar37._0_4_;
                            fVar216 = local_d8 * 3.0 * auVar185._0_4_ * auVar185._0_4_;
                            fVar226 = auVar185._0_4_ * local_d8 * local_d8 * 3.0;
                            fVar228 = local_d8 * local_d8 * local_d8;
                            auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar41._0_4_)),
                                                      ZEXT416((uint)fVar226),auVar40);
                            auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar216),auVar55);
                            auVar51 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar231),auVar51);
                            fVar227 = auVar51._0_4_;
                            if ((fVar99 <= fVar227) &&
                               (fVar229 = *(float *)(ray + k * 4 + 0x80), fVar227 <= fVar229)) {
                              local_c8 = vshufps_avx(auVar37,auVar37,0x55);
                              auVar54 = vsubps_avx512vl(auVar53,local_c8);
                              fVar230 = local_c8._0_4_;
                              auVar208._0_4_ = fVar230 * (float)local_248._0_4_;
                              fVar144 = local_c8._4_4_;
                              auVar208._4_4_ = fVar144 * (float)local_248._4_4_;
                              fVar145 = local_c8._8_4_;
                              auVar208._8_4_ = fVar145 * fStack_240;
                              fVar146 = local_c8._12_4_;
                              auVar208._12_4_ = fVar146 * fStack_23c;
                              auVar213._0_4_ = fVar230 * (float)local_258._0_4_;
                              auVar213._4_4_ = fVar144 * (float)local_258._4_4_;
                              auVar213._8_4_ = fVar145 * fStack_250;
                              auVar213._12_4_ = fVar146 * fStack_24c;
                              auVar224._0_4_ = fVar230 * (float)local_268._0_4_;
                              auVar224._4_4_ = fVar144 * (float)local_268._4_4_;
                              auVar224._8_4_ = fVar145 * fStack_260;
                              auVar224._12_4_ = fVar146 * fStack_25c;
                              auVar241._0_4_ = fVar230 * (float)local_278._0_4_;
                              auVar241._4_4_ = fVar144 * (float)local_278._4_4_;
                              auVar241._8_4_ = fVar145 * fStack_270;
                              auVar241._12_4_ = fVar146 * fStack_26c;
                              auVar37 = vfmadd231ps_fma(auVar208,auVar54,local_208);
                              auVar51 = vfmadd231ps_fma(auVar213,auVar54,local_218);
                              auVar53 = vfmadd231ps_fma(auVar224,auVar54,local_228);
                              auVar54 = vfmadd231ps_fma(auVar241,auVar54,local_238);
                              auVar37 = vsubps_avx(auVar51,auVar37);
                              auVar51 = vsubps_avx(auVar53,auVar51);
                              auVar53 = vsubps_avx(auVar54,auVar53);
                              auVar225._0_4_ = auVar51._0_4_ * local_d8;
                              auVar225._4_4_ = auVar51._4_4_ * local_d8;
                              auVar225._8_4_ = auVar51._8_4_ * local_d8;
                              auVar225._12_4_ = auVar51._12_4_ * local_d8;
                              auVar185._4_4_ = auVar185._0_4_;
                              auVar185._8_4_ = auVar185._0_4_;
                              auVar185._12_4_ = auVar185._0_4_;
                              auVar37 = vfmadd231ps_fma(auVar225,auVar185,auVar37);
                              auVar194._0_4_ = auVar53._0_4_ * local_d8;
                              auVar194._4_4_ = auVar53._4_4_ * local_d8;
                              auVar194._8_4_ = auVar53._8_4_ * local_d8;
                              auVar194._12_4_ = auVar53._12_4_ * local_d8;
                              auVar51 = vfmadd231ps_fma(auVar194,auVar185,auVar51);
                              auVar195._0_4_ = auVar51._0_4_ * local_d8;
                              auVar195._4_4_ = auVar51._4_4_ * local_d8;
                              auVar195._8_4_ = auVar51._8_4_ * local_d8;
                              auVar195._12_4_ = auVar51._12_4_ * local_d8;
                              auVar37 = vfmadd231ps_fma(auVar195,auVar185,auVar37);
                              auVar18._8_4_ = 0x40400000;
                              auVar18._0_8_ = 0x4040000040400000;
                              auVar18._12_4_ = 0x40400000;
                              auVar37 = vmulps_avx512vl(auVar37,auVar18);
                              pGVar7 = (context->scene->geometries).items[uVar30].ptr;
                              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                                bVar21 = 0;
                              }
                              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                      (bVar21 = 1,
                                      pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar178._0_4_ = fVar228 * (float)local_2d8._0_4_;
                                auVar178._4_4_ = fVar228 * (float)local_2d8._4_4_;
                                auVar178._8_4_ = fVar228 * fStack_2d0;
                                auVar178._12_4_ = fVar228 * fStack_2cc;
                                auVar163._4_4_ = fVar226;
                                auVar163._0_4_ = fVar226;
                                auVar163._8_4_ = fVar226;
                                auVar163._12_4_ = fVar226;
                                auVar51 = vfmadd132ps_fma(auVar163,auVar178,local_2c8);
                                auVar134._4_4_ = fVar216;
                                auVar134._0_4_ = fVar216;
                                auVar134._8_4_ = fVar216;
                                auVar134._12_4_ = fVar216;
                                auVar51 = vfmadd132ps_fma(auVar134,auVar51,local_2b8);
                                auVar121._4_4_ = fVar231;
                                auVar121._0_4_ = fVar231;
                                auVar121._8_4_ = fVar231;
                                auVar121._12_4_ = fVar231;
                                auVar54 = vfmadd132ps_fma(auVar121,auVar51,local_2a8);
                                auVar51 = vshufps_avx(auVar54,auVar54,0xc9);
                                auVar53 = vshufps_avx(auVar37,auVar37,0xc9);
                                auVar122._0_4_ = auVar54._0_4_ * auVar53._0_4_;
                                auVar122._4_4_ = auVar54._4_4_ * auVar53._4_4_;
                                auVar122._8_4_ = auVar54._8_4_ * auVar53._8_4_;
                                auVar122._12_4_ = auVar54._12_4_ * auVar53._12_4_;
                                auVar51 = vfmsub231ps_fma(auVar122,auVar37,auVar51);
                                auVar37 = vshufps_avx(auVar51,auVar51,0x55);
                                local_f8 = vshufps_avx(auVar51,auVar51,0xaa);
                                local_e8 = auVar51._0_4_;
                                local_108[0] = (RTCHitN)auVar37[0];
                                local_108[1] = (RTCHitN)auVar37[1];
                                local_108[2] = (RTCHitN)auVar37[2];
                                local_108[3] = (RTCHitN)auVar37[3];
                                local_108[4] = (RTCHitN)auVar37[4];
                                local_108[5] = (RTCHitN)auVar37[5];
                                local_108[6] = (RTCHitN)auVar37[6];
                                local_108[7] = (RTCHitN)auVar37[7];
                                local_108[8] = (RTCHitN)auVar37[8];
                                local_108[9] = (RTCHitN)auVar37[9];
                                local_108[10] = (RTCHitN)auVar37[10];
                                local_108[0xb] = (RTCHitN)auVar37[0xb];
                                local_108[0xc] = (RTCHitN)auVar37[0xc];
                                local_108[0xd] = (RTCHitN)auVar37[0xd];
                                local_108[0xe] = (RTCHitN)auVar37[0xe];
                                local_108[0xf] = (RTCHitN)auVar37[0xf];
                                uStack_e4 = local_e8;
                                uStack_e0 = local_e8;
                                uStack_dc = local_e8;
                                fStack_d4 = local_d8;
                                fStack_d0 = local_d8;
                                fStack_cc = local_d8;
                                local_b8 = local_298._0_8_;
                                uStack_b0 = local_298._8_8_;
                                local_a8 = local_2e8;
                                vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                                uStack_94 = context->user->instID[0];
                                local_98 = uStack_94;
                                uStack_90 = uStack_94;
                                uStack_8c = uStack_94;
                                uStack_88 = context->user->instPrimID[0];
                                uStack_84 = uStack_88;
                                uStack_80 = uStack_88;
                                uStack_7c = uStack_88;
                                *(float *)(ray + k * 4 + 0x80) = fVar227;
                                local_378 = local_2f8;
                                local_328.valid = (int *)local_378;
                                local_328.geometryUserPtr = pGVar7->userPtr;
                                local_328.context = context->user;
                                local_328.ray = (RTCRayN *)ray;
                                local_328.hit = local_108;
                                local_328.N = 4;
                                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar7->occlusionFilterN)(&local_328);
                                  auVar269 = ZEXT464(0x3f800000);
                                  auVar37 = vxorps_avx512vl(auVar50,auVar50);
                                  auVar264 = ZEXT1664(auVar37);
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar268 = ZEXT1664(auVar37);
                                }
                                auVar37 = auVar264._0_16_;
                                uVar36 = vptestmd_avx512vl(local_378,local_378);
                                auVar85._16_16_ = DAT_01feed20._16_16_;
                                if ((uVar36 & 0xf) == 0) {
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar267 = ZEXT1664(auVar37);
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar270 = ZEXT1664(auVar37);
                                  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar265 = ZEXT3264(auVar81);
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                  auVar266 = ZEXT1664(auVar37);
                                  in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                }
                                else {
                                  p_Var12 = context->args->filter;
                                  if (p_Var12 == (RTCFilterFunctionN)0x0) {
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar267 = ZEXT1664(auVar37);
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar270 = ZEXT1664(auVar37);
                                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar265 = ZEXT3264(auVar81);
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar266 = ZEXT1664(auVar37);
                                    in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                  }
                                  else {
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar267 = ZEXT1664(auVar50);
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar270 = ZEXT1664(auVar50);
                                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar265 = ZEXT3264(auVar81);
                                    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar266 = ZEXT1664(auVar50);
                                    in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                    if (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                       (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                      (*p_Var12)(&local_328);
                                      in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar266 = ZEXT1664(auVar50);
                                      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar265 = ZEXT3264(auVar85);
                                      auVar269 = ZEXT464(0x3f800000);
                                      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar270 = ZEXT1664(auVar50);
                                      auVar37 = vxorps_avx512vl(auVar37,auVar37);
                                      auVar264 = ZEXT1664(auVar37);
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar268 = ZEXT1664(auVar37);
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar267 = ZEXT1664(auVar37);
                                    }
                                  }
                                  uVar36 = vptestmd_avx512vl(local_378,local_378);
                                  uVar36 = uVar36 & 0xf;
                                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar33 = (bool)((byte)uVar36 & 1);
                                  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
                                  bVar31 = (bool)((byte)(uVar36 >> 2) & 1);
                                  bVar32 = SUB81(uVar36 >> 3,0);
                                  *(uint *)(local_328.ray + 0x80) =
                                       (uint)bVar33 * auVar37._0_4_ |
                                       (uint)!bVar33 * *(int *)(local_328.ray + 0x80);
                                  *(uint *)(local_328.ray + 0x84) =
                                       (uint)bVar34 * auVar37._4_4_ |
                                       (uint)!bVar34 * *(int *)(local_328.ray + 0x84);
                                  *(uint *)(local_328.ray + 0x88) =
                                       (uint)bVar31 * auVar37._8_4_ |
                                       (uint)!bVar31 * *(int *)(local_328.ray + 0x88);
                                  *(uint *)(local_328.ray + 0x8c) =
                                       (uint)bVar32 * auVar37._12_4_ |
                                       (uint)!bVar32 * *(int *)(local_328.ray + 0x8c);
                                  bVar21 = 1;
                                  if ((byte)uVar36 != 0) goto LAB_01bc82ec;
                                }
                                *(float *)(ray + k * 4 + 0x80) = fVar229;
                                bVar21 = 0;
                              }
LAB_01bc82ec:
                              bVar29 = (bool)(bVar29 | bVar21);
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar25 = lVar25 + -1;
                } while (lVar25 != 0);
              }
            }
          }
          if (uVar22 == 0) break;
        } while( true );
      }
      if (bVar29) {
        return bVar29;
      }
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar17._4_4_ = uVar100;
      auVar17._0_4_ = uVar100;
      auVar17._8_4_ = uVar100;
      auVar17._12_4_ = uVar100;
      uVar13 = vcmpps_avx512vl(local_288,auVar17,2);
      uVar30 = (uint)uVar35 & (uint)uVar35 + 0xf & (uint)uVar13;
      uVar35 = (ulong)uVar30;
    } while (uVar30 != 0);
  }
  return bVar29;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }